

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O1

int mp3dec_decode_frame(mp3dec_t *dec,uint8_t *mp3,int mp3_bytes,mp3d_sample_t *pcm,
                       mp3dec_frame_info_t *info)

{
  uint8_t *h;
  char *pcVar1;
  uint *puVar2;
  mp3d_sample_t *pcm_00;
  mp3d_sample_t *pcm_01;
  int *piVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  ushort uVar8;
  short sVar9;
  short sVar10;
  undefined2 uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined8 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  mp3dec_frame_info_t *pmVar38;
  byte bVar39;
  int iVar40;
  uint uVar41;
  int iVar42;
  int iVar43;
  uint32_t uVar44;
  uint32_t uVar45;
  uint32_t uVar46;
  long lVar47;
  undefined4 extraout_var;
  bs_t *pbVar48;
  byte bVar49;
  undefined1 uVar50;
  uint uVar51;
  int iVar52;
  uint uVar53;
  ulong uVar54;
  uint uVar55;
  float *pfVar56;
  float *pfVar57;
  uint uVar58;
  void *pvVar59;
  undefined4 *puVar60;
  void *__dest;
  float *pfVar61;
  long lVar62;
  undefined1 *puVar63;
  float (*pafVar64) [288];
  uint *puVar65;
  uint uVar66;
  long lVar67;
  float *pfVar68;
  byte bVar69;
  float *pfVar70;
  float (*pafVar71) [288];
  float *pfVar72;
  mp3dec_t *pmVar73;
  long lVar74;
  uint uVar75;
  ulong uVar76;
  long lVar77;
  uint uVar78;
  uint uVar79;
  float *pfVar80;
  ulong uVar81;
  int iVar82;
  long lVar83;
  byte *pbVar84;
  byte bVar85;
  bool bVar86;
  byte bVar87;
  float fVar88;
  float fVar89;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar90 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar104;
  undefined1 auVar103 [16];
  float fVar105;
  float fVar106;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  uint8_t scf_size [4];
  bs_t bs_frame [1];
  mp3dec_scratch_t scratch;
  float afStack_4fb4 [64];
  float afStack_4eb4 [64];
  float afStack_4db4 [64];
  float afStack_4cb4 [64];
  float afStack_4bb4 [64];
  float afStack_4ab4 [64];
  float afStack_49b4 [64];
  float afStack_48b4 [64];
  float afStack_47b4 [64];
  float afStack_46b4 [64];
  float afStack_45b4 [64];
  float afStack_44b4 [64];
  float afStack_43b4 [49];
  undefined8 uStack_42f0;
  float (*local_42e8) [288];
  float *local_42e0;
  float *local_42d8;
  bs_t *local_42d0;
  bs_t *local_42c8;
  float *local_42c0;
  undefined4 uStack_42b4;
  undefined8 local_42b0;
  float *local_42a8;
  float *local_42a0;
  float *local_4298;
  float (*local_4290) [288];
  byte local_4284 [4];
  bs_t *local_4280;
  bs_t local_4278;
  mp3dec_frame_info_t *local_4260;
  float (*local_4258) [288];
  mp3d_sample_t *local_4250;
  long local_4248;
  long local_4240;
  float *local_4238;
  float (*local_4230) [288];
  long local_4228;
  long local_4220;
  float *local_4218;
  long local_4210;
  undefined1 *local_4208;
  long local_4200;
  long local_41f8;
  byte *local_41f0;
  ulong local_41e8;
  long local_41e0;
  long local_41d8;
  long local_41d0;
  long local_41c8;
  ulong local_41c0;
  undefined4 local_41b8;
  float fStack_41b4;
  undefined8 uStack_41b0;
  float afStack_41a8 [24];
  undefined8 local_4148;
  undefined8 uStack_4140;
  float local_4138 [28];
  undefined8 local_40c8;
  undefined8 uStack_40c0;
  float local_40b8 [66];
  bs_t local_3fb0;
  float local_3fa0 [704];
  undefined8 local_34a0;
  undefined1 local_3498 [8];
  byte bStack_3490;
  undefined2 local_348f;
  byte local_348d [3];
  undefined2 local_348a;
  byte local_3488 [104];
  float local_3420 [14];
  float local_33e8 [5];
  byte local_33d4 [1004];
  float local_2fe8 [18];
  float local_2fa0 [288];
  undefined1 local_2b20 [16];
  float afStack_2b10 [572];
  float local_2220 [40];
  undefined4 local_2180 [60];
  float local_2090 [64];
  float afStack_1f90 [896];
  float afStack_1190 [64];
  float afStack_1090 [68];
  undefined1 local_f80 [3840];
  undefined1 local_80 [39];
  byte local_59 [41];
  
  bVar87 = 0;
  pbVar48 = (bs_t *)(ulong)(uint)mp3_bytes;
  pfVar56 = (float *)0x0;
  local_42e0 = (float *)mp3;
  if ((4 < mp3_bytes) && (pfVar56 = (float *)0x0, dec->header[0] == 0xff)) {
    uStack_42f0 = 0x14927f;
    iVar40 = hdr_compare(dec->header,mp3);
    pfVar80 = local_42e0;
    pfVar56 = (float *)0x0;
    if (iVar40 != 0) {
      uStack_42f0 = 0x1492a2;
      iVar40 = hdr_frame_bytes((uint8_t *)local_42e0,dec->free_format_bytes);
      iVar82 = 0;
      if (((uint)*pfVar80 & 0x20000) != 0) {
        iVar82 = (uint)((~*(byte *)((long)local_42e0 + 1) & 6) == 0) * 3 + 1;
      }
      uVar41 = iVar82 + iVar40;
      pfVar56 = (float *)(ulong)uVar41;
      if (uVar41 != mp3_bytes) {
        if ((int)(uVar41 + 4) <= mp3_bytes) {
          uStack_42f0 = 0x14b442;
          iVar40 = hdr_compare((uint8_t *)local_42e0,
                               (uint8_t *)((long)(int)uVar41 + (long)local_42e0));
          if (iVar40 != 0) goto LAB_00148d94;
        }
        pfVar56 = (float *)0x0;
      }
    }
  }
LAB_00148d94:
  iVar40 = 0;
  local_42b0 = dec;
  local_4260 = info;
  if ((int)pfVar56 == 0) {
    local_42a0 = (float *)0x0;
    uStack_42f0 = 0x148dc9;
    local_4250 = pcm;
    memset(dec,0,0x1a0c);
    local_4290 = (float (*) [288])0x0;
    if (4 < mp3_bytes) {
      local_42c8 = (bs_t *)CONCAT44(local_42c8._4_4_,mp3_bytes - 4U);
      local_4290 = (float (*) [288])(ulong)(mp3_bytes - 4U);
      pfVar80 = local_42e0 + 1;
      pfVar57 = (float *)0x0;
      pfVar72 = local_42e0;
      local_42d0 = pbVar48;
      local_42a0 = pfVar56;
      local_4280 = pbVar48;
      local_4258 = local_4290;
      do {
        uStack_42f0 = 0x148e18;
        iVar40 = hdr_valid((uint8_t *)pfVar72);
        if (iVar40 != 0) {
          uStack_42f0 = 0x148e33;
          uVar41 = hdr_frame_bytes((uint8_t *)pfVar72,local_42b0->free_format_bytes);
          uVar54 = (ulong)uVar41;
          iVar40 = 0;
          if (((uint)*pfVar72 & 0x20000) != 0) {
            iVar40 = (uint)((~*(byte *)((long)pfVar72 + 1) & 6) == 0) * 3 + 1;
          }
          local_42d8 = (float *)(ulong)(iVar40 + uVar41);
          bVar86 = uVar41 == 0;
          local_42a8 = pfVar80;
          local_4298 = pfVar57;
          if (bVar86) {
            bVar86 = true;
            if ((int)pfVar57 + 8 < (int)local_42c8) {
              iVar40 = 4;
              lVar83 = 0;
              do {
                local_42e8 = (float (*) [288])(lVar83 + 4);
                uStack_42f0 = 0x148ea6;
                iVar42 = hdr_compare((uint8_t *)pfVar72,(uint8_t *)((long)pfVar72 + lVar83 + 4));
                iVar82 = (int)pfVar57;
                if (iVar42 == 0) {
LAB_00148f34:
                  uVar54 = 0;
                }
                else {
                  iVar42 = 0;
                  uVar76 = 0;
                  if (((uint)*pfVar72 & 0x20000) != 0) {
                    uVar76 = (ulong)(-(uint)((~*(byte *)((long)pfVar72 + 1) & 6) != 0) | 0xfffffffc)
                    ;
                  }
                  if ((*(byte *)((long)pfVar72 + lVar83 + 6) & 2) != 0) {
                    iVar42 = (uint)((~*(byte *)((long)pfVar72 + lVar83 + 5) & 6) == 0) * 3 + 1;
                  }
                  iVar42 = iVar42 + (int)uVar76;
                  if ((int)local_42d0 < iVar42 + iVar82 + 0xc) goto LAB_00148f34;
                  uStack_42f0 = 0x148f09;
                  iVar42 = hdr_compare((uint8_t *)pfVar72,
                                       (uint8_t *)((ulong)(uint)(iVar42 + iVar40) + (long)pfVar80));
                  uVar54 = 0;
                  if (iVar42 != 0) {
                    uVar54 = lVar83 + uVar76 + 4;
                    local_42b0->free_format_bytes = (int)uVar54;
                    local_42d8 = (float *)((ulong)local_42e8 & 0xffffffff);
                  }
                }
                bVar86 = (int)uVar54 == 0;
                if ((0x8fe < local_42e8) || ((int)uVar54 != 0)) break;
                pfVar80 = (float *)((long)pfVar80 + 1);
                iVar40 = iVar40 + 1;
                lVar83 = lVar83 + 1;
                pfVar57 = (float *)((long)pfVar57 + 2);
              } while (iVar82 + 10 < (int)local_42c8);
            }
          }
          if ((bVar86) || ((int)local_42d0 < (int)local_4298 + (int)local_42d8)) {
LAB_00149032:
            if ((local_4298 == (float *)0x0) && ((int)local_42d8 == (int)local_42d0)) {
              bVar86 = false;
              local_42a0 = local_42d8;
              local_4290 = (float (*) [288])0x0;
            }
            else {
              local_42b0->free_format_bytes = 0;
              bVar86 = true;
            }
          }
          else {
            local_42e8 = (float (*) [288])((long)local_4280 - (long)local_4298);
            iVar82 = 0;
            iVar40 = 0;
            local_42c0 = (float *)uVar54;
            do {
              h = (uint8_t *)((long)pfVar72 + (long)iVar40);
              uStack_42f0 = 0x148fab;
              iVar42 = hdr_frame_bytes(h,(int)local_42c0);
              iVar43 = 0;
              if ((*(byte *)((long)pfVar72 + (long)iVar40 + 2) & 2) != 0) {
                iVar43 = (uint)((~h[1] & 6) == 0) * 3 + 1;
              }
              if ((long)local_42e8 < (long)(iVar43 + iVar42 + iVar40 + 4)) {
                if (iVar82 == 0) goto LAB_00149032;
                break;
              }
              iVar40 = iVar42 + iVar40 + iVar43;
              uStack_42f0 = 0x148ff3;
              iVar42 = hdr_compare((uint8_t *)pfVar72,(uint8_t *)((long)iVar40 + (long)pfVar72));
              if (iVar42 == 0) goto LAB_00149032;
              iVar82 = iVar82 + -1;
            } while (iVar82 != -10);
            bVar86 = false;
            local_42a0 = local_42d8;
            local_4290 = (float (*) [288])((ulong)local_4298 & 0xffffffff);
          }
          mp3_bytes = (int)local_42d0;
          pbVar48 = local_42d0;
          pfVar80 = local_42a8;
          pfVar57 = local_4298;
          if (!bVar86) goto LAB_0014909e;
        }
        mp3_bytes = (int)pbVar48;
        pfVar57 = (float *)((long)pfVar57 + 1);
        pfVar72 = (float *)((long)pfVar72 + 1);
        pfVar80 = (float *)((long)pfVar80 + 1);
      } while ((float (*) [288])pfVar57 != local_4258);
      local_42a0 = (float *)0x0;
      local_4290 = (float (*) [288])((ulong)local_42c8 & 0xffffffff);
    }
LAB_0014909e:
    iVar40 = (int)local_4290;
    if (((int)local_42a0 == 0) ||
       (pfVar56 = local_42a0, pcm = local_4250, mp3_bytes < iVar40 + (int)local_42a0)) {
      local_4260->frame_bytes = iVar40;
      return 0;
    }
  }
  lVar47 = (long)iVar40;
  *(undefined4 *)local_42b0->header = *(undefined4 *)((long)local_42e0 + lVar47);
  local_4260->frame_bytes = iVar40 + (int)pfVar56;
  local_4260->channels = (*(byte *)((long)local_42e0 + lVar47 + 3) < 0xc0) + 1;
  bVar85 = *(byte *)((long)local_42e0 + lVar47 + 1);
  lVar83 = (long)local_42e0 + lVar47;
  local_4260->hz =
       (*(uint *)(hdr_sample_rate_hz(unsigned_char_const*)::g_hz +
                 (*(byte *)((long)local_42e0 + lVar47 + 2) & 0xc)) >> ((bVar85 & 8) == 0)) >>
       ((bVar85 & 0x10) == 0);
  uVar41 = *(byte *)((long)local_42e0 + lVar47 + 1) >> 1 & 3;
  local_4260->layer = 4 - uVar41;
  bVar85 = *(byte *)((long)local_42e0 + lVar47 + 1);
  local_4260->bitrate_kbps =
       (uint)(byte)hdr_bitrate_kbps(unsigned_char_const*)::halfrate
                   [(ulong)(*(byte *)((long)local_42e0 + lVar47 + 2) >> 4) +
                    (long)(int)((bVar85 >> 1 & 3) - 1) * 0xf + (ulong)(bVar85 >> 3 & 1) * 0x2d] * 2;
  if (pcm == (mp3d_sample_t *)0x0) {
    if ((~*(byte *)(lVar83 + 1) & 6) != 0) {
      return 0x480 >> ((*(byte *)(lVar83 + 1) & 0xe) == 2);
    }
    return 0x180;
  }
  local_4278.buf = (uint8_t *)(lVar83 + 4);
  local_4278.pos = 0;
  local_4278.limit = (int)pfVar56 * 8 + -0x20;
  bVar85 = *(byte *)(lVar83 + 1);
  if ((bVar85 & 1) == 0) {
    uStack_42f0 = 0x1491ca;
    get_bits(&local_4278,0x10);
  }
  if ((char)uVar41 == '\x01') {
    iVar40 = ((bVar85 >> 3 & 1) + (uint)((bVar85 >> 4 & 1) != 0)) * 3 +
             (*(byte *)(lVar83 + 2) >> 2 & 3);
    uVar45 = 0;
    uVar41 = (*(byte *)(lVar83 + 3) < 0xc0) + 1;
    local_4250 = pcm;
    local_4248 = lVar83;
    if ((bVar85 & 8) == 0) {
      uStack_42f0 = 0x149237;
      uVar44 = get_bits(&local_4278,uVar41 | 8);
      local_42a8 = (float *)(ulong)(uVar44 >> (sbyte)uVar41);
      uVar75 = uVar41;
    }
    else {
      uVar75 = uVar41 * 2;
      uStack_42f0 = 0x1492fc;
      uVar45 = get_bits(&local_4278,9);
      local_42a8 = (float *)CONCAT44(extraout_var,uVar45);
      uStack_42f0 = 0x149311;
      uVar45 = get_bits(&local_4278,uVar41 * 2 + 7);
    }
    lVar83 = (long)(int)(iVar40 + -1 + (uint)(iVar40 == 0));
    local_42c8 = (bs_t *)(L3_read_side_info(bs_t*,L3_gr_info_t*,unsigned_char_const*)::g_scf_long +
                         lVar83 * 0x17);
    lVar83 = lVar83 * 0x28;
    local_42d8 = (float *)(L3_read_side_info(bs_t*,L3_gr_info_t*,unsigned_char_const*)::g_scf_mixed
                          + lVar83);
    local_4298 = (float *)(L3_read_side_info(bs_t*,L3_gr_info_t*,unsigned_char_const*)::g_scf_short
                          + lVar83);
    local_42c0 = (float *)CONCAT71(local_42c0._1_7_,*(undefined1 *)(local_4248 + 3));
    local_42d0 = (bs_t *)((ulong)local_42d0 & 0xffffffff00000000);
    pbVar84 = local_3488 + 7;
    do {
      local_42e8 = (float (*) [288])(ulong)uVar75;
      uVar41 = uVar45 << 4;
      if ((byte)local_42c0 < 0xc0) {
        uVar41 = uVar45;
      }
      uVar54 = (ulong)uVar41;
      uStack_42f0 = 0x1493a1;
      uVar45 = get_bits(&local_4278,0xc);
      *(short *)(pbVar84 + -0x17) = (short)uVar45;
      uStack_42f0 = 0x1493b5;
      uVar44 = get_bits(&local_4278,9);
      *(short *)(pbVar84 + -0x15) = (short)uVar44;
      iVar40 = -1;
      if (0x120 < (uVar44 & 0xffff)) goto LAB_001495dd;
      uStack_42f0 = 0x1493db;
      uVar44 = get_bits(&local_4278,8);
      pbVar84[-0x11] = (byte)uVar44;
      bVar85 = *(byte *)(local_4248 + 1);
      uStack_42f0 = 0x149402;
      uVar44 = get_bits(&local_4278,(uint)((bVar85 & 8) == 0) * 5 + 4);
      *(short *)(pbVar84 + -0x13) = (short)uVar44;
      *(bs_t **)(pbVar84 + -0x1f) = local_42c8;
      pbVar84[-0xe] = 0x16;
      pbVar84[-0xd] = 0;
      uStack_42f0 = 0x149424;
      uVar44 = get_bits(&local_4278,1);
      if (uVar44 == 0) {
        pbVar84[-0x10] = 0;
        pbVar84[-0xf] = 0;
        uStack_42f0 = 0x14948f;
        uVar44 = get_bits(&local_4278,0xf);
        uStack_42f0 = 0x14949f;
        uVar46 = get_bits(&local_4278,4);
        pbVar84[-9] = (byte)uVar46;
        uStack_42f0 = 0x1494b0;
        uVar46 = get_bits(&local_4278,3);
        pbVar84[-8] = (byte)uVar46;
        pbVar84[-7] = 0xff;
      }
      else {
        uStack_42f0 = 0x149435;
        uVar44 = get_bits(&local_4278,2);
        pbVar84[-0x10] = (byte)uVar44;
        if ((byte)uVar44 == 0) goto LAB_001495dd;
        uStack_42f0 = 0x14944e;
        uVar44 = get_bits(&local_4278,1);
        pbVar84[-0xf] = (byte)uVar44;
        pbVar84[-9] = 7;
        pbVar84[-8] = 0xff;
        if (pbVar84[-0x10] == 2) {
          if ((byte)uVar44 == 0) {
            pbVar84[-9] = 8;
            *(float **)(pbVar84 + -0x1f) = local_4298;
            bVar49 = 0x27;
            bVar39 = 0;
          }
          else {
            *(float **)(pbVar84 + -0x1f) = local_42d8;
            bVar39 = ((bVar85 & 8) >> 2) + 6;
            bVar49 = 0x1e;
          }
          uVar54 = (ulong)(uVar41 & 0xf0f);
          pbVar84[-0xe] = bVar39;
          pbVar84[-0xd] = bVar49;
        }
        uStack_42f0 = 0x1494e8;
        uVar44 = get_bits(&local_4278,10);
        uVar44 = uVar44 << 5;
        uStack_42f0 = 0x1494fc;
        uVar46 = get_bits(&local_4278,3);
        pbVar84[-6] = (byte)uVar46;
        uStack_42f0 = 0x14950d;
        uVar46 = get_bits(&local_4278,3);
        pbVar84[-5] = (byte)uVar46;
        uStack_42f0 = 0x14951e;
        uVar46 = get_bits(&local_4278,3);
        pbVar84[-4] = (byte)uVar46;
      }
      pbVar84[-0xc] = (byte)(uVar44 >> 10);
      pbVar84[-0xb] = (byte)(uVar44 >> 5) & 0x1f;
      pbVar84[-10] = (byte)uVar44 & 0x1f;
      if ((bVar85 & 8) == 0) {
        bVar85 = 499 < *(ushort *)(pbVar84 + -0x13);
      }
      else {
        uStack_42f0 = 0x149562;
        uVar44 = get_bits(&local_4278,1);
        bVar85 = (byte)uVar44;
      }
      pafVar71 = local_42e8;
      local_42d0 = (bs_t *)CONCAT44(local_42d0._4_4_,(int)local_42d0 + (uVar45 & 0xffff));
      pbVar84[-3] = bVar85;
      uStack_42f0 = 0x149588;
      uVar45 = get_bits(&local_4278,1);
      pbVar84[-2] = (byte)uVar45;
      uStack_42f0 = 0x149599;
      uVar45 = get_bits(&local_4278,1);
      pbVar84[-1] = (byte)uVar45;
      *pbVar84 = (byte)(uVar54 >> 0xc) & 0xf;
      uVar45 = (int)uVar54 << 4;
      pbVar84 = pbVar84 + 0x20;
      uVar75 = (int)pafVar71 - 1;
    } while (uVar75 != 0);
    iVar40 = -1;
    if ((int)local_42d0 + local_4278.pos <= (int)local_42a8 * 8 + local_4278.limit) {
      iVar40 = (int)local_42a8;
    }
LAB_001495dd:
    iVar82 = local_4278.pos;
    pmVar73 = local_42b0;
    if ((iVar40 < 0) ||
       (iVar42 = local_4278.limit - local_4278.pos, local_4278.limit < local_4278.pos)) {
      local_42b0->header[0] = '\0';
      uVar41 = 1;
      bVar86 = false;
    }
    else {
      iVar43 = local_42b0->reserv;
      local_42e8 = (float (*) [288])CONCAT44(local_42e8._4_4_,iVar43);
      iVar52 = iVar40;
      if (iVar43 < iVar40) {
        iVar52 = iVar43;
      }
      uVar76 = 0;
      uVar54 = (ulong)(uint)(iVar43 - iVar40);
      if (iVar43 - iVar40 < 1) {
        uVar54 = uVar76;
      }
      iVar43 = iVar42 + 7;
      if (-1 < iVar42) {
        iVar43 = iVar42;
      }
      uStack_42f0 = 0x149658;
      memcpy(local_3fa0,local_42b0->reserv_buf + uVar54,(long)iVar52);
      iVar42 = iVar82 + 7;
      if (-1 < iVar82) {
        iVar42 = iVar82;
      }
      uStack_42f0 = 0x149684;
      memcpy((void *)((long)local_3fa0 + (long)iVar52),local_4278.buf + (iVar42 >> 3),
             (long)(iVar43 >> 3));
      local_3fb0.limit = ((iVar43 >> 3) + iVar52) * 8;
      local_3fb0.buf = (uint8_t *)local_3fa0;
      local_3fb0.pos = 0;
      uStack_42b4._3_1_ = iVar40 <= (int)local_42e8;
      if (iVar40 <= (int)local_42e8) {
        local_4238 = pmVar73->qmf_state;
        do {
          pmVar38 = local_4260;
          uStack_42f0 = 0x1496e4;
          memset(local_3420,0,0x1200);
          iVar40 = pmVar38->channels;
          local_41e8 = uVar76;
          local_42e0 = (float *)(local_3498 + ((long)(iVar40 * (int)uVar76) * 0x10 + -4) * 2);
          local_4280 = (bs_t *)(long)iVar40;
          if (0 < (long)(long)iVar40) {
            pfVar56 = (float *)0x0;
            do {
              lVar83 = (long)pfVar56 * 0x20;
              local_4290 = (float (*) [288])((long)local_42e0 + (long)pfVar56 * 4 * 8);
              cVar4 = *(char *)((long)local_42e0 + lVar83 + 0x11);
              cVar5 = *(char *)((long)local_42e0 + lVar83 + 0x12);
              uVar8 = *(ushort *)((long)local_42e0 + ((long)pfVar56 * 4 + 1) * 8);
              local_42c8 = (bs_t *)(L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,bs_t*,L3_gr_info_t_const*,float*,int)
                                    ::g_scf_partitions +
                                   (((ulong)(cVar4 == '\0') + 1) - (ulong)(cVar5 == '\0')) * 0x1c);
              bVar85 = *(byte *)((long)local_42e0 + lVar83 + 0x1d);
              local_42a0 = pfVar56;
              if ((pmVar73->header[1] & 8) == 0) {
                bVar39 = (pmVar73->header[3] & 0x10) >> 4 & pfVar56 != (float *)0x0;
                uVar41 = (uint)(*(ushort *)(*local_4290 + 3) >> bVar39);
                uVar54 = 0;
                if (bVar39 != 0) {
                  uVar54 = 0xc;
                }
                puVar63 = L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,bs_t*,L3_gr_info_t_const*,float*,int)
                          ::g_mod + uVar54;
                do {
                  uVar76 = 1;
                  lVar83 = 3;
                  do {
                    bVar39 = puVar63[lVar83];
                    local_4284[lVar83] = (byte)((uVar41 / uVar76) % (ulong)bVar39);
                    uVar75 = (int)uVar76 * (uint)bVar39;
                    uVar76 = (ulong)uVar75;
                    bVar86 = lVar83 != 0;
                    lVar83 = lVar83 + -1;
                  } while (bVar86);
                  uVar54 = uVar54 + 4;
                  puVar63 = puVar63 + 4;
                  uVar41 = uVar41 - uVar75;
                } while (-1 < (int)uVar41);
                local_42c8 = (bs_t *)((long)&((bs_t *)(
                                                  L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,bs_t*,L3_gr_info_t_const*,float*,int)
                                                  ::g_scf_partitions +
                                                  (((ulong)(cVar4 == '\0') + 1) -
                                                  (ulong)(cVar5 == '\0')) * 0x1c))->buf +
                                     (uVar54 & 0xffffffff));
                uVar41 = 0xfffffff0;
              }
              else {
                uVar41 = (uint)*(byte *)((long)*local_4290 + 0x1f);
                local_4284[0] =
                     (byte)L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,bs_t*,L3_gr_info_t_const*,float*,int)
                           ::g_scfc_decode[*(ushort *)(*local_4290 + 3)] >> 2;
                local_4284[1] = local_4284[0];
                local_4284[2] =
                     L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,bs_t*,L3_gr_info_t_const*,float*,int)
                     ::g_scfc_decode[*(ushort *)(*local_4290 + 3)] & 3;
                local_4284[3] = local_4284[2];
              }
              puVar60 = &local_41b8;
              local_42a8 = (float *)((long)local_3fb0.pos + (ulong)uVar8);
              local_42e8 = (float (*) [288])(local_80 + (long)pfVar56 * 0x27);
              local_4298 = (float *)(ulong)bVar85;
              local_42d8 = (float *)CONCAT44(local_42d8._4_4_,bVar85 + 1);
              pbVar84 = (byte *)0x0;
              do {
                uVar54 = (ulong)pbVar84[(long)&local_42c8->buf];
                if (uVar54 == 0) break;
                local_42c0 = (float *)CONCAT44(local_42c0._4_4_,uVar41);
                local_42d0 = (bs_t *)pbVar84;
                if ((uVar41 & 8) == 0) {
                  bVar85 = local_4284[(long)pbVar84];
                  if (bVar85 == 0) {
                    uStack_42f0 = 0x149921;
                    memset(puVar60,0,uVar54);
                    uStack_42f0 = 0x14992f;
                    memset(local_42e8,0,uVar54);
                  }
                  else {
                    uVar45 = ~(-1 << (bVar85 & 0x1f));
                    if (-1 < (int)uVar41) {
                      uVar45 = 0xffffffff;
                    }
                    uVar76 = 0;
                    do {
                      uStack_42f0 = 0x1498de;
                      uVar44 = get_bits(&local_3fb0,(uint)bVar85);
                      uVar50 = (char)uVar44;
                      if (uVar44 == uVar45) {
                        uVar50 = 0xff;
                      }
                      *(char *)((long)puVar60 + uVar76) = (char)uVar44;
                      *(undefined1 *)((long)local_42e8 + uVar76) = uVar50;
                      uVar76 = uVar76 + 1;
                    } while (uVar54 != uVar76);
                  }
                }
                else {
                  uStack_42f0 = 0x149912;
                  memcpy(puVar60,local_42e8,uVar54);
                }
                local_42e8 = (float (*) [288])((long)local_42e8 + uVar54);
                puVar60 = (undefined4 *)((long)puVar60 + uVar54);
                pbVar84 = (byte *)((long)local_42d0 + 1);
                uVar41 = (int)local_42c0 * 2;
              } while (pbVar84 != (byte *)0x4);
              *(undefined1 *)((long)puVar60 + 2) = 0;
              *(undefined2 *)puVar60 = 0;
              bVar85 = *(byte *)((long)*local_4290 + 0x12);
              if ((ulong)bVar85 == 0) {
                if (*(char *)(*local_4290 + 7) != '\0') {
                  lVar83 = 0;
                  do {
                    pcVar1 = (char *)((long)afStack_41a8 + lVar83 + -5);
                    *pcVar1 = *pcVar1 + (&L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,bs_t*,L3_gr_info_t_const*,float*,int)
                                          ::g_preamp)[lVar83];
                    lVar83 = lVar83 + 1;
                  } while (lVar83 != 10);
                }
              }
              else {
                cVar4 = *(char *)((long)*local_4290 + 0x19);
                bVar39 = 2 - (char)local_4298;
                cVar5 = *(char *)((long)*local_4290 + 0x1a);
                uVar76 = (ulong)*(byte *)((long)*local_4290 + 0x11);
                cVar6 = *(char *)((long)*local_4290 + 0x1b);
                uVar54 = 0;
                do {
                  pcVar1 = (char *)((long)&local_41b8 + uVar54 + uVar76);
                  *pcVar1 = *pcVar1 + (cVar4 << (bVar39 & 0x1f));
                  pcVar1 = (char *)((long)&local_41b8 + uVar54 + uVar76 + 1);
                  *pcVar1 = *pcVar1 + (cVar5 << (bVar39 & 0x1f));
                  pcVar1 = (char *)((long)&local_41b8 + uVar54 + uVar76 + 2);
                  *pcVar1 = *pcVar1 + (cVar6 << (bVar39 & 0x1f));
                  uVar54 = uVar54 + 3;
                } while (uVar54 < bVar85);
              }
              fVar88 = 2048.0;
              uVar41 = ((uint)((local_42b0->header[3] & 0xe0) == 0x60) * 2 -
                       (uint)*(byte *)((long)*local_4290 + 0xe)) + 0x102;
              do {
                uVar75 = 0x78;
                if ((int)uVar41 < 0x78) {
                  uVar75 = uVar41;
                }
                fVar88 = fVar88 * (float)(int)(0x40000000 >> ((byte)(uVar75 >> 2) & 0x1f)) *
                                  (float)(&L3_ldexp_q2(float,int)::g_expfrac)[uVar75 & 3];
                uVar53 = uVar41 - uVar75;
                bVar86 = (int)uVar75 <= (int)uVar41;
                uVar41 = uVar53;
              } while (uVar53 != 0 && bVar86);
              uVar41 = (uint)bVar85 + (uint)*(byte *)((long)*local_4290 + 0x11);
              if (uVar41 != 0) {
                uVar54 = 0;
                do {
                  fVar94 = fVar88;
                  uVar75 = (uint)*(byte *)((long)&local_41b8 + uVar54) << ((byte)local_42d8 & 0x1f);
                  do {
                    uVar53 = 0x78;
                    if ((int)uVar75 < 0x78) {
                      uVar53 = uVar75;
                    }
                    fVar94 = fVar94 * (float)(int)(0x40000000 >> ((byte)(uVar53 >> 2) & 0x1f)) *
                                      (float)(&L3_ldexp_q2(float,int)::g_expfrac)[uVar53 & 3];
                    uVar58 = uVar75 - uVar53;
                    bVar86 = (int)uVar53 <= (int)uVar75;
                    uVar75 = uVar58;
                  } while (uVar58 != 0 && bVar86);
                  local_2220[uVar54] = fVar94;
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar41);
              }
              pfVar56 = local_3420 + (long)local_42a0 * 0x240;
              uVar41 = local_3fb0.pos + 7;
              if (-1 < local_3fb0.pos) {
                uVar41 = local_3fb0.pos;
              }
              local_4258 = (float (*) [288])local_3fb0.buf;
              puVar2 = (uint *)((long)(float *)local_3fb0.buf + (long)((int)uVar41 >> 3));
              puVar65 = puVar2 + 1;
              uVar41 = *puVar2;
              uVar54 = (ulong)((uVar41 >> 0x18 | (uVar41 & 0xff0000) >> 8 | (uVar41 & 0xff00) << 8 |
                               uVar41 << 0x18) << ((byte)local_3fb0.pos & 7));
              uVar8 = *(ushort *)((long)*local_4290 + 10);
              uVar75 = (uint)uVar8;
              uVar41 = local_3fb0.pos | 0xfffffff8;
              pbVar84 = *(byte **)*local_4290;
              if (uVar8 == 0) {
                fVar88 = 0.0;
                local_42e8 = (float (*) [288])local_2220;
              }
              else {
                puVar63 = (undefined1 *)0x0;
                local_42e8 = (float (*) [288])local_2220;
                do {
                  bVar85 = puVar63[(long)((long)*local_4290 + 0x13)];
                  local_4298 = (float *)puVar63;
                  pfVar80 = (float *)(ulong)(byte)puVar63[(long)((long)*local_4290 + 0x16)];
                  sVar9 = *(short *)(L3_huffman(float*,bs_t*,L3_gr_info_t_const*,float_const*,int)::
                                     tabindex + (ulong)bVar85 * 2);
                  if (bVar85 < 0x10) {
                    local_42c0 = pfVar80;
                    uVar53 = uVar75;
                    do {
                      uVar58 = (uint)(*pbVar84 >> 1);
                      uVar75 = uVar58;
                      if ((int)uVar53 < (int)uVar58) {
                        uVar75 = uVar53;
                      }
                      fVar88 = (*local_42e8)[0];
                      do {
                        pfVar80 = pfVar56;
                        uVar66 = (uint)uVar54;
                        uVar78 = (uint)*(short *)(L3_huffman(float*,bs_t*,L3_gr_info_t_const*,float_const*,int)
                                                  ::tabs + (uVar54 >> 0x1b) * 2 + (long)sVar9 * 2);
                        uVar76 = (ulong)uVar78;
                        if ((int)uVar78 < 0) {
                          uVar78 = 5;
                          do {
                            uVar66 = (int)uVar54 << (sbyte)uVar78;
                            uVar54 = (ulong)uVar66;
                            uVar41 = uVar41 + uVar78;
                            uVar78 = (uint)uVar76 & 7;
                            uVar79 = (uint)*(short *)(
                                                  L3_huffman(float*,bs_t*,L3_gr_info_t_const*,float_const*,int)
                                                  ::tabs + (ulong)((uVar66 >>
                                                                   (-(char)uVar78 & 0x1fU)) -
                                                                  ((int)(uint)uVar76 >> 3)) * 2 +
                                                           (long)sVar9 * 2);
                            uVar76 = (ulong)uVar79;
                          } while ((int)uVar79 < 0);
                        }
                        uVar54 = (ulong)(uVar66 << ((byte)(uVar76 >> 8) & 0x1f));
                        uVar41 = (int)(uVar76 >> 8) + uVar41;
                        lVar83 = 0;
                        do {
                          *(float *)((long)pfVar80 + lVar83) =
                               g_pow43[((uint)(uVar54 >> 0x1b) & 0x10 | (uint)uVar76 & 0xf) ^ 0x10]
                               * fVar88;
                          bVar86 = (uVar76 & 0xf) != 0;
                          uVar54 = (ulong)(uint)((int)uVar54 << bVar86);
                          uVar41 = uVar41 + bVar86;
                          uVar76 = uVar76 >> 4;
                          lVar83 = lVar83 + 4;
                        } while ((int)lVar83 == 4);
                        uVar66 = uVar41;
                        if (-1 < (int)uVar41) {
                          do {
                            uVar41 = *puVar65;
                            puVar65 = (uint *)((long)puVar65 + 1);
                            uVar54 = (ulong)((uint)uVar54 |
                                            (uint)(byte)uVar41 << ((byte)uVar66 & 0x1f));
                            uVar41 = uVar66 - 8;
                            bVar86 = 7 < (int)uVar66;
                            uVar66 = uVar41;
                          } while (bVar86);
                        }
                        uVar75 = uVar75 - 1;
                        pfVar56 = (float *)((long)pfVar80 + lVar83);
                      } while (uVar75 != 0);
                      pbVar84 = pbVar84 + 1;
                      local_42e8 = (float (*) [288])(*local_42e8 + 1);
                      uVar75 = uVar53 - uVar58;
                      if (uVar75 == 0 || (int)uVar53 < (int)uVar58) break;
                      iVar40 = (int)local_42c0;
                      pfVar56 = (float *)((long)pfVar80 + lVar83);
                      local_42c0 = (float *)(ulong)(iVar40 - 1);
                      uVar53 = uVar75;
                    } while (0 < iVar40);
                    pfVar56 = (float *)((long)pfVar80 + lVar83);
                  }
                  else {
                    bVar85 = L3_huffman(float*,bs_t*,L3_gr_info_t_const*,float_const*,int)::
                             g_linbits[bVar85];
                    uVar53 = uVar75;
                    do {
                      local_42c0 = pfVar80;
                      local_42d0 = (bs_t *)pbVar84;
                      uVar58 = (uint)(*pbVar84 >> 1);
                      local_42d8 = (float *)CONCAT44(local_42d8._4_4_,uVar58);
                      local_42c8 = (bs_t *)CONCAT44(local_42c8._4_4_,uVar53);
                      uVar75 = uVar58;
                      if ((int)uVar53 < (int)uVar58) {
                        uVar75 = uVar53;
                      }
                      fVar88 = (*local_42e8)[0];
                      do {
                        uVar66 = (uint)uVar54;
                        sVar10 = *(short *)(L3_huffman(float*,bs_t*,L3_gr_info_t_const*,float_const*,int)
                                            ::tabs + (uVar54 >> 0x1b) * 2 + (long)sVar9 * 2);
                        uVar78 = (uint)sVar10;
                        if (sVar10 < 0) {
                          uVar79 = 5;
                          do {
                            uVar66 = (int)uVar54 << (sbyte)uVar79;
                            uVar54 = (ulong)uVar66;
                            uVar41 = uVar41 + uVar79;
                            uVar79 = uVar78 & 7;
                            sVar10 = *(short *)(L3_huffman(float*,bs_t*,L3_gr_info_t_const*,float_const*,int)
                                                ::tabs + (ulong)((uVar66 >> (-(char)uVar79 & 0x1fU))
                                                                - ((int)uVar78 >> 3)) * 2 +
                                                         (long)sVar9 * 2);
                            uVar78 = (uint)sVar10;
                          } while (sVar10 < 0);
                        }
                        uVar54 = (ulong)(uVar66 << ((byte)(uVar78 >> 8) & 0x1f));
                        uVar41 = (uVar78 >> 8) + uVar41;
                        iVar40 = 0;
                        do {
                          uVar66 = uVar78 & 0xf;
                          uVar79 = (uint)uVar54;
                          if (uVar66 == 0xf) {
                            uVar55 = uVar79 >> (0x20 - bVar85 & 0x1f);
                            uVar79 = uVar79 << (bVar85 & 0x1f);
                            uVar41 = uVar41 + bVar85;
                            uVar66 = uVar41;
                            if (-1 < (int)uVar41) {
                              do {
                                uVar41 = *puVar65;
                                puVar65 = (uint *)((long)puVar65 + 1);
                                uVar79 = uVar79 | (uint)(byte)uVar41 << ((byte)uVar66 & 0x1f);
                                uVar41 = uVar66 - 8;
                                bVar86 = 7 < (int)uVar66;
                                uVar66 = uVar41;
                              } while (bVar86);
                            }
                            uVar66 = uVar55 + 0xf;
                            if ((int)uVar66 < 0x81) {
                              fVar94 = g_pow43[(int)(uVar55 + 0x1f)];
                            }
                            else {
                              uVar51 = uVar66 * 8;
                              if (SBORROW4(uVar66,0x400) == (int)(uVar55 - 0x3f1) < 0) {
                                uVar51 = uVar66;
                              }
                              uVar55 = uVar51 * 2 & 0x40;
                              fVar94 = (float)(int)((uVar51 & 0x3f) - uVar55) /
                                       (float)(int)((uVar51 & 0x7fffffc0) + uVar55);
                              fVar94 = ((fVar94 * 0.22222222 + 1.3333334) * fVar94 + 1.0) *
                                       g_pow43[(ulong)(uVar55 + uVar51 >> 6) + 0x10] *
                                       *(float *)(&DAT_003384a8 + (ulong)((int)uVar66 < 0x400) * 4);
                            }
                            fVar94 = (float)(int)((int)uVar79 >> 0x1f | 1) * fVar94 * fVar88;
                          }
                          else {
                            fVar94 = g_pow43[((uint)(uVar54 >> 0x1b) & 0x10 | uVar66) ^ 0x10] *
                                     fVar88;
                          }
                          uVar54 = (ulong)(uVar79 << (uVar66 != 0));
                          *pfVar56 = fVar94;
                          uVar41 = uVar41 + (uVar66 != 0);
                          pfVar56 = pfVar56 + 1;
                          uVar78 = uVar78 >> 4;
                          bVar86 = iVar40 == 0;
                          iVar40 = iVar40 + 1;
                        } while (bVar86);
                        uVar66 = uVar41;
                        if (-1 < (int)uVar41) {
                          do {
                            uVar41 = *puVar65;
                            puVar65 = (uint *)((long)puVar65 + 1);
                            uVar54 = (ulong)((uint)uVar54 |
                                            (uint)(byte)uVar41 << ((byte)uVar66 & 0x1f));
                            uVar41 = uVar66 - 8;
                            bVar86 = 7 < (int)uVar66;
                            uVar66 = uVar41;
                          } while (bVar86);
                        }
                        uVar75 = uVar75 - 1;
                      } while (uVar75 != 0);
                      pbVar84 = pbVar84 + 1;
                      local_42e8 = (float (*) [288])(*local_42e8 + 1);
                      uVar75 = uVar53 - uVar58;
                    } while ((uVar75 != 0 && (int)uVar58 <= (int)uVar53) &&
                            (iVar40 = (int)pfVar80, pfVar80 = (float *)(ulong)(iVar40 - 1),
                            uVar53 = uVar75, 0 < iVar40));
                  }
                  puVar63 = puVar63 + 1;
                } while (0 < (int)uVar75);
              }
              uVar75 = 1 - uVar75;
              puVar63 = L3_huffman(float*,bs_t*,L3_gr_info_t_const*,float_const*,int)::tab33;
              if (*(char *)((long)*local_4290 + 0x1e) == '\0') {
                puVar63 = L3_huffman(float*,bs_t*,L3_gr_info_t_const*,float_const*,int)::tab32;
              }
              do {
                bVar85 = puVar63[uVar54 >> 0x1c];
                if ((bVar85 & 8) == 0) {
                  bVar85 = puVar63[(ulong)((uint)((int)uVar54 << 4) >> (-(bVar85 & 3) & 0x1f)) +
                                   (ulong)(bVar85 >> 3)];
                }
                uVar53 = bVar85 & 7;
                uVar58 = (int)uVar54 << (sbyte)uVar53;
                uVar54 = (ulong)uVar58;
                uVar41 = uVar53 + uVar41;
                if ((long)local_42a8 <
                    (long)(int)uVar41 + ((long)puVar65 - (long)local_3fb0.buf) * 8 + -0x18) {
LAB_00149f1e:
                  bVar86 = false;
                }
                else {
                  uVar75 = uVar75 - 1;
                  if (uVar75 == 0) {
                    bVar39 = *pbVar84;
                    pbVar84 = pbVar84 + 1;
                    uVar75 = 0;
                    if (bVar39 < 2) goto LAB_00149f1e;
                    fVar88 = (*local_42e8)[0];
                    local_42e8 = (float (*) [288])(*local_42e8 + 1);
                    uVar75 = (uint)(bVar39 >> 1);
                  }
                  if (0x7f < bVar85) {
                    fVar94 = fVar88;
                    if ((int)uVar58 < 0) {
                      fVar94 = -fVar88;
                    }
                    *pfVar56 = fVar94;
                    uVar54 = (ulong)(uVar58 * 2);
                    uVar41 = uVar41 + 1;
                  }
                  if ((bVar85 & 0x40) != 0) {
                    fVar94 = fVar88;
                    if ((int)uVar54 < 0) {
                      fVar94 = -fVar88;
                    }
                    pfVar56[1] = fVar94;
                    uVar54 = (ulong)(uint)((int)uVar54 * 2);
                    uVar41 = uVar41 + 1;
                  }
                  uVar75 = uVar75 - 1;
                  if (uVar75 == 0) {
                    bVar39 = *pbVar84;
                    pbVar84 = pbVar84 + 1;
                    uVar75 = 0;
                    if (bVar39 < 2) goto LAB_00149f1e;
                    fVar88 = (*local_42e8)[0];
                    local_42e8 = (float (*) [288])(*local_42e8 + 1);
                    uVar75 = (uint)(bVar39 >> 1);
                  }
                  if ((bVar85 & 0x20) != 0) {
                    fVar94 = fVar88;
                    if ((int)uVar54 < 0) {
                      fVar94 = -fVar88;
                    }
                    pfVar56[2] = fVar94;
                    uVar54 = (ulong)(uint)((int)uVar54 * 2);
                    uVar41 = uVar41 + 1;
                  }
                  if ((bVar85 & 0x10) != 0) {
                    fVar94 = fVar88;
                    if ((int)uVar54 < 0) {
                      fVar94 = -fVar88;
                    }
                    pfVar56[3] = fVar94;
                    uVar54 = (ulong)(uint)((int)uVar54 * 2);
                    uVar41 = uVar41 + 1;
                  }
                  bVar86 = true;
                  uVar53 = uVar41;
                  if (-1 < (int)uVar41) {
                    do {
                      uVar41 = *puVar65;
                      puVar65 = (uint *)((long)puVar65 + 1);
                      uVar54 = (ulong)((uint)uVar54 | (uint)(byte)uVar41 << ((byte)uVar53 & 0x1f));
                      uVar41 = uVar53 - 8;
                      bVar12 = 7 < (int)uVar53;
                      uVar53 = uVar41;
                    } while (bVar12);
                  }
                }
                pfVar56 = pfVar56 + 4;
              } while (bVar86);
              local_3fb0.pos = (uint)local_42a8;
              pfVar56 = (float *)((long)local_42a0 + 1);
              pmVar73 = local_42b0;
            } while ((bs_t *)pfVar56 != local_4280);
          }
          bVar85 = pmVar73->header[3];
          if ((bVar85 & 0x10) == 0) {
            if ((bVar85 & 0xe0) == 0x60) {
              uVar54 = 0xfffffffffffffffc;
              do {
                fVar88 = local_3420[uVar54 + 4];
                fVar94 = local_3420[uVar54 + 5];
                fVar131 = local_3420[uVar54 + 6];
                fVar99 = local_3420[uVar54 + 7];
                fVar100 = afStack_2b10[uVar54];
                fVar101 = afStack_2b10[uVar54 + 1];
                fVar105 = afStack_2b10[uVar54 + 2];
                fVar109 = local_2220[uVar54 - 0x239];
                local_3420[uVar54 + 4] = fVar88 + fVar100;
                local_3420[uVar54 + 5] = fVar94 + fVar101;
                local_3420[uVar54 + 6] = fVar131 + fVar105;
                local_3420[uVar54 + 7] = fVar99 + fVar109;
                afStack_2b10[uVar54] = fVar88 - fVar100;
                afStack_2b10[uVar54 + 1] = fVar94 - fVar101;
                afStack_2b10[uVar54 + 2] = fVar131 - fVar105;
                local_2220[uVar54 - 0x239] = fVar99 - fVar109;
                uVar54 = uVar54 + 4;
              } while (uVar54 < 0x239);
            }
          }
          else {
            bVar39 = *(byte *)((long)local_42e0 + 0x11);
            bVar49 = *(byte *)((long)local_42e0 + 0x12);
            lVar83 = *(long *)local_42e0;
            uStack_41b0._0_4_ = -NAN;
            _local_41b8 = 0xffffffffffffffff;
            uVar41 = (uint)bVar49 + (uint)bVar39;
            if (uVar41 != 0) {
              uVar54 = 0;
              puVar63 = local_2b20;
              do {
                uVar76 = (ulong)*(byte *)(lVar83 + uVar54);
                if (uVar76 != 0) {
                  uVar81 = 0;
                  do {
                    if ((((*(float *)(puVar63 + uVar81 * 4) != 0.0) ||
                         (NAN(*(float *)(puVar63 + uVar81 * 4)))) ||
                        (*(float *)(puVar63 + uVar81 * 4 + 4) != 0.0)) ||
                       (NAN(*(float *)(puVar63 + uVar81 * 4 + 4)))) {
                      (&local_41b8)[(uint)((int)uVar54 + (int)((uVar54 & 0xffffffff) / 3) * -3)] =
                           (int)uVar54;
                      break;
                    }
                    uVar81 = uVar81 + 2;
                  } while (uVar81 < uVar76);
                }
                puVar63 = puVar63 + uVar76 * 4;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar41);
            }
            if (bVar39 != 0) {
              if ((int)fStack_41b4 < (int)local_41b8) {
                fStack_41b4 = local_41b8;
              }
              if ((int)fStack_41b4 <= (int)(float)uStack_41b0) {
                fStack_41b4 = (float)uStack_41b0;
              }
              uStack_41b0._0_4_ = fStack_41b4;
              _local_41b8 = CONCAT44(fStack_41b4,fStack_41b4);
            }
            uVar75 = (uint)(bVar49 != 0) * 2 + 1;
            lVar83 = (long)(int)(uVar41 - uVar75) + -0x59;
            uVar54 = 0;
            do {
              if ((int)(&local_41b8)[uVar54] < (int)(uVar41 + uVar75 * -2 + (int)uVar54)) {
                bVar39 = local_59[uVar54 + (lVar83 - (ulong)uVar75) + 0x59];
              }
              else {
                bVar39 = (char)(pmVar73->header[1] << 4) >> 7 & 3;
              }
              local_59[uVar54 + lVar83 + 0x59] = bVar39;
              uVar54 = uVar54 + 1;
            } while (uVar54 != uVar75);
            pbVar84 = *(byte **)local_42e0;
            bVar39 = pmVar73->header[1];
            bVar49 = 7;
            if ((bVar39 & 8) == 0) {
              bVar49 = 0x40;
            }
            bVar69 = *pbVar84;
            if (bVar69 != 0) {
              uVar11 = *(undefined2 *)((long)local_42e0 + 0x2c);
              fVar88 = *(float *)(&DAT_003384b0 + (ulong)((bVar85 & 0x20) == 0) * 4);
              uVar54 = 0;
              pfVar56 = local_3420;
              do {
                iVar40 = (int)uVar54;
                if ((int)(&local_41b8)[(uint)(iVar40 + (int)(uVar54 / 3) * -3)] < iVar40) {
                  bVar7 = local_59[uVar54];
                  if (bVar49 <= bVar7) goto LAB_0014a33d;
                  if ((bVar39 & 8) == 0) {
                    fVar131 = 1.0;
                    uVar41 = (bVar7 + 1 >> 1) << ((byte)uVar11 & 1);
                    do {
                      uVar76 = 0x78;
                      if ((int)uVar41 < 0x78) {
                        uVar76 = (ulong)uVar41;
                      }
                      uVar53 = (uint)uVar76;
                      fVar131 = fVar131 * (float)(int)(0x40000000 >> ((byte)(uVar76 >> 2) & 0x1f)) *
                                          (float)(&L3_ldexp_q2(float,int)::g_expfrac)[uVar53 & 3];
                      uVar75 = uVar41 - uVar53;
                      bVar86 = (int)uVar53 <= (int)uVar41;
                      uVar41 = uVar75;
                    } while (uVar75 != 0 && bVar86);
                    pmVar73 = local_42b0;
                    if ((bVar7 & 1) == 0) {
                      fVar94 = fVar131;
                      fVar131 = 1.0;
                    }
                    else {
                      fVar94 = 1.0;
                    }
                  }
                  else {
                    fVar94 = *(float *)(L3_stereo_process(float*,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int*,int)
                                        ::g_pan + (ulong)bVar7 * 8 + 4);
                    fVar131 = *(float *)(L3_stereo_process(float*,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int*,int)
                                         ::g_pan + (ulong)bVar7 * 8);
                  }
                  uVar76 = 0;
                  do {
                    pfVar56[uVar76 + 0x240] = fVar94 * fVar88 * pfVar56[uVar76];
                    pfVar56[uVar76] = pfVar56[uVar76] * fVar131 * fVar88;
                    uVar76 = uVar76 + 1;
                  } while (bVar69 != uVar76);
                }
                else {
LAB_0014a33d:
                  if ((bVar85 & 0x20) != 0) {
                    uVar76 = 0;
                    if (3 < bVar69) {
                      uVar76 = 0;
                      do {
                        pfVar80 = pfVar56 + uVar76;
                        fVar94 = *pfVar80;
                        fVar131 = pfVar80[1];
                        fVar99 = pfVar80[2];
                        fVar100 = pfVar80[3];
                        pfVar80 = pfVar56 + uVar76 + 0x240;
                        fVar101 = *pfVar80;
                        fVar105 = pfVar80[1];
                        fVar109 = pfVar80[2];
                        fVar111 = pfVar80[3];
                        pfVar80 = pfVar56 + uVar76;
                        *pfVar80 = fVar94 + fVar101;
                        pfVar80[1] = fVar131 + fVar105;
                        pfVar80[2] = fVar99 + fVar109;
                        pfVar80[3] = fVar100 + fVar111;
                        pfVar80 = pfVar56 + uVar76 + 0x240;
                        *pfVar80 = fVar94 - fVar101;
                        pfVar80[1] = fVar131 - fVar105;
                        pfVar80[2] = fVar99 - fVar109;
                        pfVar80[3] = fVar100 - fVar111;
                        uVar76 = uVar76 + 4;
                      } while ((long)uVar76 < (long)(int)(bVar69 - 3));
                    }
                    if ((int)uVar76 < (int)(uint)bVar69) {
                      uVar76 = uVar76 & 0xffffffff;
                      do {
                        fVar94 = pfVar56[uVar76];
                        pfVar56[uVar76] = fVar94 + pfVar56[uVar76 + 0x240];
                        pfVar56[uVar76 + 0x240] = fVar94 - pfVar56[uVar76 + 0x240];
                        uVar76 = uVar76 + 1;
                      } while (bVar69 != uVar76);
                    }
                  }
                }
                pfVar56 = pfVar56 + pbVar84[uVar54];
                uVar54 = (ulong)(iVar40 + 1);
                bVar69 = pbVar84[uVar54];
              } while (bVar69 != 0);
            }
          }
          if (0 < (int)local_4280) {
            pbVar84 = local_33d4;
            local_42c8 = &local_3fb0;
            local_42d8 = local_33e8;
            pfVar80 = (float *)0x0;
            pfVar56 = local_42e0;
            do {
              local_42d0 = (bs_t *)pbVar84;
              lVar83 = *(long *)((long)pfVar56 + 0x10);
              iVar40 = (uint)((char)lVar83 != '\0') * 2 <<
                       ((byte)(((pmVar73->header[1] >> 3 & 1) + ((pmVar73->header[1] >> 4 & 1) != 0)
                               ) * '\x03' + (pmVar73->header[2] >> 2 & 3)) == '\x02');
              local_42c0 = pfVar80;
              if (*(char *)((long)pfVar56 + 0x12) == '\0') {
                iVar82 = 0x1f;
              }
              else {
                __dest = (void *)((long)local_3420 +
                                 (ulong)(uint)(iVar40 * 0x48) + (long)pfVar80 * 0x900);
                bVar85 = *(byte *)(*(long *)pfVar56 + (ulong)*(byte *)((long)pfVar56 + 0x11));
                puVar60 = local_2180;
                if (bVar85 != 0) {
                  lVar47 = *(long *)pfVar56 + (ulong)*(byte *)((long)pfVar56 + 0x11);
                  pvVar59 = __dest;
                  do {
                    uVar54 = (ulong)bVar85;
                    lVar67 = 0;
                    do {
                      *puVar60 = *(undefined4 *)((long)pvVar59 + lVar67);
                      puVar60[1] = *(undefined4 *)((long)pvVar59 + lVar67 + uVar54 * 4);
                      puVar60[2] = *(undefined4 *)((long)pvVar59 + lVar67 + uVar54 * 8);
                      puVar60 = puVar60 + 3;
                      lVar67 = lVar67 + 4;
                    } while (((uint)bVar85 + (uint)(uVar54 == 0)) * 4 != (int)lVar67);
                    pvVar59 = (void *)((long)pvVar59 + lVar67 + uVar54 * 8);
                    bVar85 = *(byte *)(lVar47 + 3);
                    lVar47 = lVar47 + 3;
                  } while (bVar85 != 0);
                }
                iVar82 = iVar40 + -1;
                uStack_42f0 = 0x14a580;
                memcpy(__dest,local_2180,(long)puVar60 - (long)local_2180);
              }
              pbVar48 = local_42c8;
              pfVar80 = local_42d8;
              if (0 < iVar82) {
                do {
                  lVar47 = 0;
                  pfVar72 = pfVar80;
                  do {
                    piVar3 = &pbVar48[0xbd].pos + lVar47;
                    fVar88 = (float)*piVar3;
                    fVar94 = (float)piVar3[1];
                    fVar131 = (float)piVar3[2];
                    fVar99 = (float)piVar3[3];
                    fVar100 = *pfVar72;
                    fVar101 = pfVar72[1];
                    fVar105 = pfVar72[2];
                    fVar109 = pfVar72[3];
                    lVar67 = lVar47 * 4;
                    fVar111 = *(float *)(L3_antialias(float*,int)::g_aa + lVar67);
                    fVar113 = *(float *)(L3_antialias(float*,int)::g_aa + lVar67 + 4);
                    fVar115 = *(float *)(L3_antialias(float*,int)::g_aa + lVar67 + 8);
                    fVar117 = *(float *)(L3_antialias(float*,int)::g_aa + lVar67 + 0xc);
                    lVar67 = lVar47 * 4;
                    fVar119 = *(float *)(L3_antialias(float*,int)::g_aa + lVar67 + 0x20);
                    fVar121 = *(float *)(L3_antialias(float*,int)::g_aa + lVar67 + 0x24);
                    fVar123 = *(float *)(L3_antialias(float*,int)::g_aa + lVar67 + 0x28);
                    fVar125 = *(float *)(L3_antialias(float*,int)::g_aa + lVar67 + 0x2c);
                    piVar3 = &pbVar48[0xbd].pos + lVar47;
                    *piVar3 = (int)(fVar88 * fVar111 - fVar109 * fVar119);
                    piVar3[1] = (int)(fVar94 * fVar113 - fVar105 * fVar121);
                    piVar3[2] = (int)(fVar131 * fVar115 - fVar101 * fVar123);
                    piVar3[3] = (int)(fVar99 * fVar117 - fVar100 * fVar125);
                    *pfVar72 = fVar100 * fVar117 + fVar99 * fVar125;
                    pfVar72[1] = fVar101 * fVar115 + fVar131 * fVar123;
                    pfVar72[2] = fVar105 * fVar113 + fVar94 * fVar121;
                    pfVar72[3] = fVar109 * fVar111 + fVar88 * fVar119;
                    lVar47 = lVar47 + 4;
                    pfVar72 = pfVar72 + -4;
                  } while (lVar47 == 4);
                  bVar86 = 1 < iVar82;
                  pbVar48 = (bs_t *)&pbVar48[4].pos;
                  pfVar80 = pfVar80 + 0x12;
                  iVar82 = iVar82 + -1;
                } while (bVar86);
              }
              pfVar80 = local_3420 + (long)local_42c0 * 0x240;
              pafVar71 = local_42b0->mdct_overlap + (long)local_42c0;
              cVar4 = *(char *)((long)pfVar56 + 0xf);
              if ((char)lVar83 != '\0') {
                uStack_42f0 = 0x14a647;
                L3_imdct36(pfVar80,*pafVar71,
                           (float *)L3_imdct_gr(float*,float*,unsigned_int,unsigned_int)::
                                    g_mdct_window,iVar40);
                pfVar80 = (float *)((long)pfVar80 + (ulong)(uint)(iVar40 * 0x48));
                pafVar71 = (float (*) [288])((long)*pafVar71 + (ulong)(uint)(iVar40 * 0x24));
              }
              local_42e0 = pfVar56;
              if (cVar4 == '\x02') {
                iVar40 = 0x21 - iVar40;
                local_42e8 = pafVar71;
                lVar83 = 0;
                do {
                  pfVar72 = *local_42e8;
                  pfVar56 = (float *)((long)pfVar80 + lVar83 * 2);
                  pfVar57 = pfVar56;
                  pfVar61 = (float *)&local_41b8;
                  for (lVar47 = 0x12; lVar47 != 0; lVar47 = lVar47 + -1) {
                    *pfVar61 = *pfVar57;
                    pfVar57 = pfVar57 + (ulong)bVar87 * -2 + 1;
                    pfVar61 = pfVar61 + (ulong)bVar87 * -2 + 1;
                  }
                  pfVar57 = (float *)((long)*local_42e8 + lVar83 + 0x18);
                  *(undefined8 *)(pfVar56 + 4) = *(undefined8 *)(pfVar57 + -2);
                  uVar35 = *(undefined8 *)(pfVar57 + -4);
                  *(undefined8 *)pfVar56 = *(undefined8 *)(pfVar57 + -6);
                  *(undefined8 *)(pfVar56 + 2) = uVar35;
                  uStack_42f0 = 0x14a6c9;
                  L3_imdct12((float *)&local_41b8,(float *)((long)pfVar80 + lVar83 * 2 + 0x18),
                             pfVar57);
                  uStack_42f0 = 0x14a6e1;
                  L3_imdct12(&fStack_41b4,(float *)((long)pfVar80 + lVar83 * 2 + 0x30),pfVar57);
                  uStack_42f0 = 0x14a6f4;
                  L3_imdct12((float *)&uStack_41b0,(float *)((long)pfVar72 + lVar83),pfVar57);
                  iVar40 = iVar40 + -1;
                  lVar83 = lVar83 + 0x24;
                } while (1 < iVar40);
              }
              else {
                uStack_42f0 = 0x14a72b;
                L3_imdct36(pfVar80,*pafVar71,
                           (float *)(L3_imdct_gr(float*,float*,unsigned_int,unsigned_int)::
                                     g_mdct_window + (ulong)(cVar4 == '\x03') * 0x48),0x20 - iVar40)
                ;
              }
              pbVar48 = local_42d0;
              uVar41 = 0;
              do {
                uVar54 = 0xffffffffffffffff;
                do {
                  *(uint *)((long)pbVar48 + uVar54 * 4 + 4) =
                       *(uint *)((long)pbVar48 + uVar54 * 4 + 4) ^ 0x80000000;
                  uVar54 = uVar54 + 2;
                } while (uVar54 < 0x10);
                pbVar48 = (bs_t *)((long)pbVar48 + 0x90);
                bVar86 = uVar41 < 0x1e;
                uVar41 = uVar41 + 2;
              } while (bVar86);
              pfVar80 = (float *)((long)local_42c0 + 1);
              pfVar56 = (float *)((long)local_42e0 + 0x20);
              local_42d8 = local_42d8 + 0x240;
              local_42c8 = local_42c8 + 0x90;
              pbVar84 = (byte *)((long)local_42d0 + 0x900);
              pmVar73 = local_42b0;
            } while ((bs_t *)pfVar80 != local_4280);
          }
          local_4240 = (long)local_4260->channels;
          if (0 < local_4240) {
            pfVar56 = local_3420;
            pfVar80 = local_2fe8;
            lVar83 = 0;
            do {
              pfVar72 = pfVar56;
              pfVar57 = pfVar80;
              uVar54 = 0;
              do {
                pfVar70 = (float *)&DAT_0033a428;
                lVar47 = 0;
                pfVar61 = pfVar72;
                pfVar68 = pfVar57;
                do {
                  fVar105 = *pfVar61 + pfVar68[0x120];
                  fVar109 = pfVar61[1] + pfVar68[0x121];
                  fVar111 = pfVar61[2] + pfVar68[0x122];
                  fVar113 = pfVar61[3] + pfVar68[0x123];
                  fVar115 = *pfVar68 + pfVar61[0x120];
                  fVar117 = pfVar68[1] + pfVar61[0x121];
                  fVar119 = pfVar68[2] + pfVar61[0x122];
                  fVar121 = pfVar68[3] + pfVar61[0x123];
                  fVar88 = pfVar70[-2];
                  fVar94 = pfVar70[-1];
                  fVar131 = *pfVar70;
                  fVar99 = fVar88 * (*pfVar68 - pfVar61[0x120]);
                  fVar100 = fVar88 * (pfVar68[1] - pfVar61[0x121]);
                  fVar101 = fVar88 * (pfVar68[2] - pfVar61[0x122]);
                  fVar88 = fVar88 * (pfVar68[3] - pfVar61[0x123]);
                  fVar123 = fVar94 * (*pfVar61 - pfVar68[0x120]);
                  fVar125 = fVar94 * (pfVar61[1] - pfVar68[0x121]);
                  fVar127 = fVar94 * (pfVar61[2] - pfVar68[0x122]);
                  fVar94 = fVar94 * (pfVar61[3] - pfVar68[0x123]);
                  *(float *)((long)&local_41b8 + lVar47) = fVar115 + fVar105;
                  *(float *)((long)&fStack_41b4 + lVar47) = fVar117 + fVar109;
                  *(float *)((long)afStack_41a8 + lVar47 + -8) = fVar119 + fVar111;
                  *(float *)((long)afStack_41a8 + lVar47 + -4) = fVar121 + fVar113;
                  *(float *)((long)local_4138 + lVar47) = (fVar105 - fVar115) * fVar131;
                  *(float *)((long)local_4138 + lVar47 + 4) = (fVar109 - fVar117) * fVar131;
                  *(float *)((long)local_4138 + lVar47 + 8) = (fVar111 - fVar119) * fVar131;
                  *(float *)((long)local_4138 + lVar47 + 0xc) = (fVar113 - fVar121) * fVar131;
                  *(float *)((long)local_40b8 + lVar47) = fVar99 + fVar123;
                  *(float *)((long)local_40b8 + lVar47 + 4) = fVar100 + fVar125;
                  *(float *)((long)local_40b8 + lVar47 + 8) = fVar101 + fVar127;
                  *(float *)((long)local_40b8 + lVar47 + 0xc) = fVar88 + fVar94;
                  *(float *)((long)local_40b8 + lVar47 + 0x80) = (fVar123 - fVar99) * fVar131;
                  *(float *)((long)local_40b8 + lVar47 + 0x84) = (fVar125 - fVar100) * fVar131;
                  *(float *)((long)local_40b8 + lVar47 + 0x88) = (fVar127 - fVar101) * fVar131;
                  *(float *)((long)local_40b8 + lVar47 + 0x8c) = (fVar94 - fVar88) * fVar131;
                  lVar47 = lVar47 + 0x10;
                  pfVar70 = pfVar70 + 3;
                  pfVar68 = pfVar68 + -0x12;
                  pfVar61 = pfVar61 + 0x12;
                } while (lVar47 != 0x80);
                lVar47 = 0;
                do {
                  fVar88 = *(float *)((long)afStack_41a8 + lVar47 + -8);
                  fVar94 = *(float *)((long)afStack_41a8 + lVar47 + -4);
                  fVar131 = *(float *)((long)afStack_41a8 + lVar47 + 4);
                  fVar99 = *(float *)((long)afStack_41a8 + lVar47 + 8);
                  fVar100 = *(float *)((long)afStack_41a8 + lVar47 + 0xc);
                  fVar101 = *(float *)((long)afStack_41a8 + lVar47 + 0x10);
                  fVar105 = *(float *)((long)afStack_41a8 + lVar47 + 0x14);
                  fVar109 = *(float *)((long)afStack_41a8 + lVar47 + 0x18);
                  fVar111 = *(float *)((long)afStack_41a8 + lVar47 + 0x1c);
                  fVar113 = *(float *)((long)afStack_41a8 + lVar47 + 0x20);
                  fVar115 = *(float *)((long)afStack_41a8 + lVar47 + 0x24);
                  fVar117 = *(float *)((long)afStack_41a8 + lVar47 + 0x28);
                  fVar119 = *(float *)((long)afStack_41a8 + lVar47 + 0x2c);
                  fVar121 = *(float *)((long)afStack_41a8 + lVar47 + 0x30);
                  fVar123 = *(float *)((long)afStack_41a8 + lVar47 + 0x34);
                  fVar125 = *(float *)((long)afStack_41a8 + lVar47 + 0x38);
                  fVar127 = *(float *)((long)afStack_41a8 + lVar47 + 0x3c);
                  fVar124 = *(float *)((long)afStack_41a8 + lVar47 + 0x40);
                  fVar126 = *(float *)((long)afStack_41a8 + lVar47 + 0x44);
                  fVar95 = *(float *)((long)afStack_41a8 + lVar47 + 0x48);
                  fVar96 = *(float *)((long)afStack_41a8 + lVar47 + 0x4c);
                  fVar130 = *(float *)((long)afStack_41a8 + lVar47 + 0x50);
                  fVar89 = *(float *)((long)afStack_41a8 + lVar47 + 0x54);
                  fVar91 = *(float *)((long)afStack_41a8 + lVar47 + 0x58);
                  fVar92 = *(float *)((long)afStack_41a8 + lVar47 + 0x5c);
                  fVar104 = *(float *)((long)&local_4148 + lVar47 + 4);
                  fVar93 = *(float *)((long)&uStack_4140 + lVar47 + 4);
                  fVar106 = *(float *)((long)&local_41b8 + lVar47) -
                            *(float *)((long)&local_4148 + lVar47);
                  fVar110 = *(float *)((long)&fStack_41b4 + lVar47) - fVar104;
                  fVar112 = fVar88 - *(float *)((long)&uStack_4140 + lVar47);
                  fVar114 = fVar94 - fVar93;
                  fVar102 = *(float *)((long)&local_41b8 + lVar47) +
                            *(float *)((long)&local_4148 + lVar47);
                  fVar104 = *(float *)((long)&fStack_41b4 + lVar47) + fVar104;
                  fVar88 = fVar88 + *(float *)((long)&uStack_4140 + lVar47);
                  fVar94 = fVar94 + fVar93;
                  fVar116 = *(float *)((long)afStack_41a8 + lVar47) - fVar130;
                  fVar118 = fVar131 - fVar89;
                  fVar120 = fVar99 - fVar91;
                  fVar122 = fVar100 - fVar92;
                  fVar130 = *(float *)((long)afStack_41a8 + lVar47) + fVar130;
                  fVar131 = fVar131 + fVar89;
                  fVar99 = fVar99 + fVar91;
                  fVar100 = fVar100 + fVar92;
                  fVar89 = fVar101 - fVar124;
                  fVar91 = fVar105 - fVar126;
                  fVar92 = fVar109 - fVar95;
                  fVar93 = fVar111 - fVar96;
                  fVar101 = fVar101 + fVar124;
                  fVar105 = fVar105 + fVar126;
                  fVar109 = fVar109 + fVar95;
                  fVar111 = fVar111 + fVar96;
                  fVar124 = fVar113 + fVar121;
                  fVar126 = fVar115 + fVar123;
                  fVar128 = fVar117 + fVar125;
                  fVar129 = fVar119 + fVar127;
                  fVar95 = fVar102 - fVar124;
                  fVar96 = fVar104 - fVar126;
                  fVar97 = fVar88 - fVar128;
                  fVar98 = fVar94 - fVar129;
                  fVar124 = fVar124 + fVar102;
                  fVar126 = fVar126 + fVar104;
                  fVar128 = fVar128 + fVar88;
                  fVar129 = fVar129 + fVar94;
                  fVar88 = fVar101 + fVar130;
                  fVar94 = fVar105 + fVar131;
                  fVar104 = fVar109 + fVar99;
                  fVar102 = fVar111 + fVar100;
                  *(float *)((long)&local_41b8 + lVar47) = fVar88 + fVar124;
                  *(float *)((long)&fStack_41b4 + lVar47) = fVar94 + fVar126;
                  *(float *)((long)afStack_41a8 + lVar47 + -8) = fVar104 + fVar128;
                  *(float *)((long)afStack_41a8 + lVar47 + -4) = fVar102 + fVar129;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x30) = (fVar124 - fVar88) * 0.70710677;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x34) = (fVar126 - fVar94) * 0.70710677;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x38) = (fVar128 - fVar104) * 0.70710677;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x3c) = (fVar129 - fVar102) * 0.70710677;
                  fVar88 = (fVar89 + fVar116) * 0.70710677;
                  fVar94 = (fVar91 + fVar118) * 0.70710677;
                  fVar124 = (fVar92 + fVar120) * 0.70710677;
                  fVar126 = (fVar93 + fVar122) * 0.70710677;
                  fVar116 = fVar116 + fVar106;
                  fVar118 = fVar118 + fVar110;
                  fVar120 = fVar120 + fVar112;
                  fVar122 = fVar122 + fVar114;
                  fVar113 = ((fVar113 - fVar121) + fVar89) - fVar116 * 0.19891237;
                  fVar115 = ((fVar115 - fVar123) + fVar91) - fVar118 * 0.19891237;
                  fVar117 = ((fVar117 - fVar125) + fVar92) - fVar120 * 0.19891237;
                  fVar119 = ((fVar119 - fVar127) + fVar93) - fVar122 * 0.19891237;
                  fVar116 = fVar113 * 0.38268343 + fVar116;
                  fVar118 = fVar115 * 0.38268343 + fVar118;
                  fVar120 = fVar117 * 0.38268343 + fVar120;
                  fVar122 = fVar119 * 0.38268343 + fVar122;
                  fVar121 = fVar106 - fVar88;
                  fVar123 = fVar110 - fVar94;
                  fVar125 = fVar112 - fVar124;
                  fVar127 = fVar114 - fVar126;
                  fVar88 = fVar88 + fVar106;
                  fVar94 = fVar94 + fVar110;
                  fVar124 = fVar124 + fVar112;
                  fVar126 = fVar126 + fVar114;
                  fVar113 = fVar113 - fVar116 * 0.19891237;
                  fVar115 = fVar115 - fVar118 * 0.19891237;
                  fVar117 = fVar117 - fVar120 * 0.19891237;
                  fVar119 = fVar119 - fVar122 * 0.19891237;
                  fVar101 = ((fVar130 - fVar101) + fVar95) * 0.70710677;
                  fVar131 = ((fVar131 - fVar105) + fVar96) * 0.70710677;
                  fVar99 = ((fVar99 - fVar109) + fVar97) * 0.70710677;
                  fVar100 = ((fVar100 - fVar111) + fVar98) * 0.70710677;
                  *(float *)((long)afStack_41a8 + lVar47) = (fVar88 + fVar116) * 0.5097956;
                  *(float *)((long)afStack_41a8 + lVar47 + 4) = (fVar94 + fVar118) * 0.5097956;
                  *(float *)((long)afStack_41a8 + lVar47 + 8) = (fVar124 + fVar120) * 0.5097956;
                  *(float *)((long)afStack_41a8 + lVar47 + 0xc) = (fVar126 + fVar122) * 0.5097956;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x10) = (fVar95 + fVar101) * 0.5411961;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x14) = (fVar96 + fVar131) * 0.5411961;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x18) = (fVar97 + fVar99) * 0.5411961;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x1c) = (fVar98 + fVar100) * 0.5411961;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x20) = (fVar121 - fVar113) * 0.6013449;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x24) = (fVar123 - fVar115) * 0.6013449;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x28) = (fVar125 - fVar117) * 0.6013449;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x2c) = (fVar127 - fVar119) * 0.6013449;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x40) = (fVar121 + fVar113) * 0.8999762;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x44) = (fVar123 + fVar115) * 0.8999762;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x48) = (fVar125 + fVar117) * 0.8999762;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x4c) = (fVar127 + fVar119) * 0.8999762;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x50) = (fVar95 - fVar101) * 1.306563;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x54) = (fVar96 - fVar131) * 1.306563;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x58) = (fVar97 - fVar99) * 1.306563;
                  *(float *)((long)afStack_41a8 + lVar47 + 0x5c) = (fVar98 - fVar100) * 1.306563;
                  *(float *)((long)&local_4148 + lVar47) = (fVar88 - fVar116) * 2.5629156;
                  *(float *)((long)&local_4148 + lVar47 + 4) = (fVar94 - fVar118) * 2.5629156;
                  *(float *)((long)&uStack_4140 + lVar47) = (fVar124 - fVar120) * 2.5629156;
                  *(float *)((long)&uStack_4140 + lVar47 + 4) = (fVar126 - fVar122) * 2.5629156;
                  lVar47 = lVar47 + 0x80;
                } while ((int)lVar47 != 0x200);
                lVar47 = 0;
                pfVar61 = local_40b8 + 0x24;
                if (uVar54 < 0x10) {
                  do {
                    uVar35 = *(undefined8 *)(pfVar61 + -0x62);
                    fVar88 = pfVar61[-4];
                    fVar94 = pfVar61[-3];
                    fVar131 = pfVar61[-2];
                    fVar99 = pfVar61[-1];
                    fVar100 = *pfVar61;
                    fVar101 = pfVar61[1];
                    fVar105 = pfVar61[2];
                    fVar109 = pfVar61[3];
                    *(undefined8 *)((long)pfVar72 + lVar47) = *(undefined8 *)(pfVar61 + -100);
                    ((undefined8 *)((long)pfVar72 + lVar47))[1] = uVar35;
                    fVar111 = pfVar61[-0x23];
                    fVar113 = pfVar61[-0x22];
                    fVar115 = pfVar61[-0x21];
                    fVar117 = pfVar61[-0x44];
                    fVar119 = pfVar61[-0x43];
                    fVar121 = pfVar61[-0x42];
                    fVar123 = pfVar61[-0x41];
                    fVar125 = pfVar61[-0x40];
                    fVar127 = pfVar61[-0x3f];
                    fVar124 = pfVar61[-0x3e];
                    fVar126 = pfVar61[-0x3d];
                    pfVar68 = (float *)((long)pfVar72 + lVar47 + 0x48);
                    *pfVar68 = pfVar61[-0x24] + fVar88 + fVar100;
                    pfVar68[1] = fVar111 + fVar94 + fVar101;
                    pfVar68[2] = fVar113 + fVar131 + fVar105;
                    pfVar68[3] = fVar115 + fVar99 + fVar109;
                    pfVar68 = (float *)((long)pfVar72 + lVar47 + 0x90);
                    *pfVar68 = fVar117 + fVar125;
                    pfVar68[1] = fVar119 + fVar127;
                    pfVar68[2] = fVar121 + fVar124;
                    pfVar68[3] = fVar123 + fVar126;
                    fVar111 = pfVar61[-0x1f];
                    fVar113 = pfVar61[-0x1e];
                    fVar115 = pfVar61[-0x1d];
                    pfVar68 = (float *)((long)pfVar72 + lVar47 + 0xd8);
                    *pfVar68 = fVar88 + fVar100 + pfVar61[-0x20];
                    pfVar68[1] = fVar94 + fVar101 + fVar111;
                    pfVar68[2] = fVar131 + fVar105 + fVar113;
                    pfVar68[3] = fVar99 + fVar109 + fVar115;
                    pfVar61 = pfVar61 + 4;
                    lVar47 = lVar47 + 0x120;
                  } while (lVar47 != 0x7e0);
                  *(undefined8 *)(pfVar72 + 0x1f8) = local_4148;
                  *(undefined8 *)(pfVar72 + 0x1fa) = uStack_4140;
                  pfVar72[0x20a] = local_40b8[0x1c] + local_40b8[0x3c];
                  pfVar72[0x20b] = local_40b8[0x1d] + local_40b8[0x3d];
                  pfVar72[0x20c] = local_40b8[0x1e] + local_40b8[0x3e];
                  pfVar72[0x20d] = local_40b8[0x1f] + local_40b8[0x3f];
                  *(undefined8 *)(pfVar72 + 0x21c) = local_40c8;
                  *(undefined8 *)(pfVar72 + 0x21e) = uStack_40c0;
                  pfVar72[0x22e] = local_40b8[0x3c];
                  pfVar72[0x22f] = local_40b8[0x3d];
                  pfVar72[0x230] = local_40b8[0x3e];
                  pfVar72[0x231] = local_40b8[0x3f];
                }
                else {
                  do {
                    fVar88 = pfVar61[-4];
                    fVar94 = pfVar61[-3];
                    fVar131 = *pfVar61;
                    fVar99 = pfVar61[1];
                    *(undefined8 *)((long)pfVar72 + lVar47) = *(undefined8 *)(pfVar61 + -100);
                    fVar100 = pfVar61[-0x44];
                    fVar101 = pfVar61[-0x43];
                    fVar105 = pfVar61[-0x40];
                    fVar109 = pfVar61[-0x3f];
                    *(ulong *)((long)pfVar72 + lVar47 + 0x48) =
                         CONCAT44(pfVar61[-0x23] + fVar94 + fVar99,pfVar61[-0x24] + fVar88 + fVar131
                                 );
                    *(ulong *)((long)pfVar72 + lVar47 + 0x90) =
                         CONCAT44(fVar101 + fVar109,fVar100 + fVar105);
                    *(ulong *)((long)pfVar72 + lVar47 + 0xd8) =
                         CONCAT44(fVar94 + fVar99 + pfVar61[-0x1f],fVar88 + fVar131 + pfVar61[-0x20]
                                 );
                    pfVar61 = pfVar61 + 4;
                    lVar47 = lVar47 + 0x120;
                  } while (lVar47 != 0x7e0);
                  *(undefined8 *)(pfVar72 + 0x1f8) = local_4148;
                  *(ulong *)(pfVar72 + 0x20a) =
                       CONCAT44(local_40b8[0x1d] + local_40b8[0x3d],
                                local_40b8[0x1c] + local_40b8[0x3c]);
                  *(undefined8 *)(pfVar72 + 0x21c) = local_40c8;
                  pfVar72[0x22e] = local_40b8[0x3c];
                  pfVar72[0x22f] = local_40b8[0x3d];
                }
                pfVar57 = pfVar57 + 4;
                pfVar72 = pfVar72 + 4;
                bVar86 = uVar54 < 0xe;
                uVar54 = uVar54 + 4;
              } while (bVar86);
              lVar83 = lVar83 + 1;
              pfVar80 = pfVar80 + 0x240;
              pfVar56 = pfVar56 + 0x240;
            } while (lVar83 != local_4240);
          }
          uStack_42f0 = 0x14abdc;
          memcpy(local_2180,local_4238,0xf00);
          lVar83 = local_4240 + -1;
          local_41c8 = (long)(int)lVar83;
          local_41d0 = lVar83 * 0x240;
          local_41d8 = (long)((int)local_4240 << 5);
          pafVar71 = (float (*) [288])(local_4240 * 2);
          pafVar64 = (float (*) [288])(local_4240 * 0x7e);
          local_41e0 = local_41d8 * 4;
          pfVar56 = (float *)((long)*pafVar64 + local_41c8 * 2);
          pbVar48 = (bs_t *)(local_4240 * 0x42);
          pbVar84 = (byte *)((long)&pbVar48->buf + local_41c8 * 2);
          pfVar80 = (float *)(local_4240 * 0x3e);
          lVar47 = (long)pfVar80 + local_41c8 * 2;
          lVar67 = local_41c8 * 2 + local_4240 * 2;
          puVar63 = (undefined1 *)(lVar83 * 0x240 + 0x3f3);
          lVar83 = lVar83 * 0x240 + 0x417;
          pfVar72 = (float *)0xfcc;
          lVar74 = 0x2f14;
          lVar77 = 0x105c;
          local_4258 = pafVar71;
          uVar54 = 0;
          do {
            lVar62 = local_41d8;
            local_4218 = pfVar72;
            local_41f8 = lVar47;
            local_42e0 = pfVar80;
            local_4230 = pafVar71;
            local_4200 = lVar67;
            local_4290 = pafVar64;
            local_4220 = lVar74;
            local_4228 = lVar77;
            local_4208 = puVar63;
            local_4210 = lVar83;
            local_4280 = pbVar48;
            local_41f0 = pbVar84;
            local_42a0 = pfVar56;
            pcm_00 = local_4250 + uVar54 * local_41d8;
            pcm_01 = pcm_00 + local_41c8;
            afStack_1190[uVar54 * 0x40] = local_2fa0[uVar54];
            afStack_1190[uVar54 * 0x40 + 1] = local_2fa0[uVar54 + local_41d0];
            afStack_1190[uVar54 * 0x40 + 2] = local_3420[uVar54];
            afStack_1190[uVar54 * 0x40 + 3] = local_3420[uVar54 + local_41d0];
            afStack_1090[uVar54 * 0x40] = local_2fa0[uVar54 + 1];
            afStack_1090[uVar54 * 0x40 + 1] = local_2fa0[uVar54 + local_41d0 + 1];
            local_41c0 = uVar54;
            afStack_1090[uVar54 * 0x40 + 2] = local_3420[uVar54 + 1];
            afStack_1090[uVar54 * 0x40 + 3] = local_3420[uVar54 + local_41d0 + 1];
            local_42e8 = (float (*) [288])(local_2090 + uVar54 * 0x40);
            iVar40 = (int)local_4240;
            uStack_42f0 = 0x14adde;
            mp3d_synth_pair(pcm_01,iVar40,local_2090 + uVar54 * 0x40 + 1);
            uStack_42f0 = 0x14adff;
            mp3d_synth_pair(pcm_01 + lVar62,iVar40,afStack_1f90 + uVar54 * 0x40 + 1);
            uStack_42f0 = 0x14ae0d;
            mp3d_synth_pair(pcm_00,iVar40,*local_42e8);
            uStack_42f0 = 0x14ae1b;
            mp3d_synth_pair(pcm_00 + lVar62,iVar40,afStack_1f90 + uVar54 * 0x40);
            auVar37 = _DAT_00338620;
            auVar36 = _DAT_00338610;
            local_42e8 = local_4230;
            local_42c0 = local_42e0;
            local_42d0 = (bs_t *)local_41f0;
            local_42c8 = local_4280;
            local_42d8 = local_42a0;
            lVar62 = 0;
            lVar83 = local_4228;
            pfVar56 = local_4218;
            lVar47 = local_4220;
            puVar63 = local_4208;
            lVar67 = local_4210;
            pafVar71 = local_4290;
            lVar74 = local_41f8;
            lVar77 = local_4200;
            do {
              local_42a8 = pfVar56;
              local_4298 = (float *)puVar63;
              *(undefined4 *)((long)local_40b8 + lVar47 + 4) =
                   *(undefined4 *)((long)local_40b8 + lVar83 + 0x104);
              *(float *)((long)local_40b8 + lVar47 + 8) = local_40b8[lVar67 + 0x41];
              *(undefined4 *)((long)local_40b8 + lVar47 + 0xc) =
                   *(undefined4 *)((long)&local_3fb0.buf + lVar83);
              *(undefined4 *)((long)local_40b8 + lVar47 + 0x10) =
                   *(undefined4 *)((long)&local_3fb0.buf + lVar67 * 4);
              *(undefined4 *)((long)local_40b8 + lVar47 + 0x104) =
                   *(undefined4 *)((long)&local_3fb0.buf + (long)pfVar56);
              *(undefined4 *)((long)&local_3fb0.buf + lVar47) =
                   *(undefined4 *)((long)&local_3fb0.buf + (long)puVar63 * 4);
              *(undefined4 *)((long)afStack_41a8 + lVar47 + -4) =
                   *(undefined4 *)((long)(local_40b8 + 0x41) + (long)pfVar56);
              *(float *)((long)afStack_41a8 + lVar47) = local_40b8[(long)(puVar63 + 0x41)];
              fVar88 = *(float *)((long)&mp3d_synth(float*,short*,int,float*)::g_win + lVar62);
              fVar94 = *(float *)((long)&DAT_0033a484 + lVar62);
              fVar131 = *(float *)((long)&DAT_0033a488 + lVar62);
              fVar99 = *(float *)((long)&DAT_0033a48c + lVar62);
              fVar127 = *(float *)((long)local_40b8 + lVar47 + 4);
              fVar124 = *(float *)((long)local_40b8 + lVar47 + 8);
              fVar126 = *(float *)((long)local_40b8 + lVar47 + 0xc);
              fVar95 = *(float *)((long)local_40b8 + lVar47 + 0x10);
              fVar96 = *(float *)((long)afStack_4fb4 + lVar47 + 4);
              fVar130 = *(float *)((long)afStack_4fb4 + lVar47 + 8);
              fVar89 = *(float *)((long)afStack_4fb4 + lVar47 + 0xc);
              fVar91 = *(float *)((long)afStack_4eb4 + lVar47 + 4);
              fVar92 = *(float *)((long)afStack_4eb4 + lVar47 + 8);
              fVar104 = *(float *)((long)afStack_4eb4 + lVar47 + 0xc);
              fVar93 = *(float *)((long)afStack_4db4 + lVar47 + 4);
              fVar97 = *(float *)((long)afStack_4db4 + lVar47 + 8);
              fVar98 = *(float *)((long)afStack_4db4 + lVar47 + 0xc);
              fVar102 = *(float *)((long)afStack_41a8 + lVar47 + -8);
              fVar106 = *(float *)((long)afStack_41a8 + lVar47 + -4);
              fVar100 = *(float *)((long)&DAT_0033a490 + lVar62);
              fVar101 = *(float *)((long)&DAT_0033a494 + lVar62);
              fVar110 = *(float *)((long)&local_42b0 + lVar47 + 4);
              fVar105 = *(float *)((long)&DAT_0033a498 + lVar62);
              fVar109 = *(float *)((long)&DAT_0033a49c + lVar62);
              fVar112 = *(float *)((long)afStack_43b4 + lVar47 + 4);
              fVar114 = *(float *)((long)afStack_43b4 + lVar47 + 8);
              fVar116 = *(float *)((long)afStack_43b4 + lVar47 + 0xc);
              fVar118 = *(float *)((long)afStack_4cb4 + lVar47 + 4);
              fVar120 = *(float *)((long)afStack_4cb4 + lVar47 + 8);
              fVar122 = *(float *)((long)afStack_4cb4 + lVar47 + 0xc);
              fVar111 = *(float *)((long)&DAT_0033a4a0 + lVar62);
              fVar113 = *(float *)((long)&DAT_0033a4a4 + lVar62);
              fVar128 = *(float *)((long)afStack_44b4 + lVar47 + 4);
              fVar129 = *(float *)((long)afStack_44b4 + lVar47 + 8);
              fVar13 = *(float *)((long)afStack_44b4 + lVar47 + 0xc);
              fVar14 = *(float *)((long)afStack_4bb4 + lVar47 + 4);
              fVar15 = *(float *)((long)afStack_4bb4 + lVar47 + 8);
              fVar16 = *(float *)((long)afStack_4bb4 + lVar47 + 0xc);
              fVar115 = *(float *)((long)&DAT_0033a4a8 + lVar62);
              fVar117 = *(float *)((long)&DAT_0033a4ac + lVar62);
              fVar17 = *(float *)((long)afStack_45b4 + lVar47 + 4);
              fVar18 = *(float *)((long)afStack_45b4 + lVar47 + 8);
              fVar19 = *(float *)((long)afStack_45b4 + lVar47 + 0xc);
              fVar20 = *(float *)((long)afStack_4ab4 + lVar47 + 4);
              fVar21 = *(float *)((long)afStack_4ab4 + lVar47 + 8);
              fVar22 = *(float *)((long)afStack_4ab4 + lVar47 + 0xc);
              fVar119 = *(float *)((long)&DAT_0033a4b0 + lVar62);
              fVar121 = *(float *)((long)&DAT_0033a4b4 + lVar62);
              fVar23 = *(float *)((long)afStack_46b4 + lVar47 + 4);
              fVar24 = *(float *)((long)afStack_46b4 + lVar47 + 8);
              fVar25 = *(float *)((long)afStack_46b4 + lVar47 + 0xc);
              fVar26 = *(float *)((long)afStack_49b4 + lVar47 + 4);
              fVar27 = *(float *)((long)afStack_49b4 + lVar47 + 8);
              fVar28 = *(float *)((long)afStack_49b4 + lVar47 + 0xc);
              fVar123 = *(float *)((long)&DAT_0033a4b8 + lVar62);
              fVar125 = *(float *)((long)&DAT_0033a4bc + lVar62);
              fVar29 = *(float *)((long)afStack_47b4 + lVar47 + 4);
              fVar30 = *(float *)((long)afStack_47b4 + lVar47 + 8);
              fVar31 = *(float *)((long)afStack_47b4 + lVar47 + 0xc);
              fVar32 = *(float *)((long)afStack_48b4 + lVar47 + 4);
              fVar33 = *(float *)((long)afStack_48b4 + lVar47 + 8);
              fVar34 = *(float *)((long)afStack_48b4 + lVar47 + 0xc);
              auVar103._0_4_ =
                   fVar123 * *(float *)((long)afStack_48b4 + lVar47) +
                   *(float *)((long)afStack_47b4 + lVar47) * fVar125 +
                   fVar119 * *(float *)((long)afStack_49b4 + lVar47) +
                   *(float *)((long)afStack_46b4 + lVar47) * fVar121 +
                   fVar115 * *(float *)((long)afStack_4ab4 + lVar47) +
                   *(float *)((long)afStack_45b4 + lVar47) * fVar117 +
                   fVar111 * *(float *)((long)afStack_4bb4 + lVar47) +
                   *(float *)((long)afStack_44b4 + lVar47) * fVar113 +
                   fVar105 * *(float *)((long)afStack_4cb4 + lVar47) +
                   *(float *)((long)afStack_43b4 + lVar47) * fVar109 +
                   fVar100 * *(float *)((long)afStack_4db4 + lVar47) +
                   *(float *)((long)&uStack_42b4 + lVar47) * fVar101 +
                   fVar131 * *(float *)((long)afStack_4eb4 + lVar47) +
                   *(float *)((long)&fStack_41b4 + lVar47) * fVar99 +
                   fVar88 * *(float *)((long)afStack_4fb4 + lVar47) + fVar127 * fVar94;
              auVar103._4_4_ =
                   fVar123 * fVar32 + fVar29 * fVar125 +
                   fVar119 * fVar26 + fVar23 * fVar121 +
                   fVar115 * fVar20 + fVar17 * fVar117 +
                   fVar111 * fVar14 + fVar128 * fVar113 +
                   fVar105 * fVar118 + fVar112 * fVar109 +
                   fVar100 * fVar93 + *(float *)((long)&local_42b0 + lVar47) * fVar101 +
                   fVar131 * fVar91 + fVar102 * fVar99 + fVar88 * fVar96 + fVar124 * fVar94;
              auVar103._8_4_ =
                   fVar123 * fVar33 + fVar30 * fVar125 +
                   fVar119 * fVar27 + fVar24 * fVar121 +
                   fVar115 * fVar21 + fVar18 * fVar117 +
                   fVar111 * fVar15 + fVar129 * fVar113 +
                   fVar105 * fVar120 + fVar114 * fVar109 +
                   fVar100 * fVar97 + fVar110 * fVar101 +
                   fVar131 * fVar92 + fVar106 * fVar99 + fVar88 * fVar130 + fVar126 * fVar94;
              auVar103._12_4_ =
                   fVar123 * fVar34 + fVar31 * fVar125 +
                   fVar119 * fVar28 + fVar25 * fVar121 +
                   fVar115 * fVar22 + fVar19 * fVar117 +
                   fVar111 * fVar16 + fVar13 * fVar113 +
                   fVar105 * fVar122 + fVar116 * fVar109 +
                   fVar100 * fVar98 + *(float *)((long)&local_42a8 + lVar47) * fVar101 +
                   fVar131 * fVar104 + *(float *)((long)afStack_41a8 + lVar47) * fVar99 +
                   fVar88 * fVar89 + fVar95 * fVar94;
              auVar108._0_4_ =
                   (fVar125 * *(float *)((long)afStack_48b4 + lVar47) -
                   *(float *)((long)afStack_47b4 + lVar47) * fVar123) +
                   (*(float *)((long)afStack_46b4 + lVar47) * fVar119 -
                   fVar121 * *(float *)((long)afStack_49b4 + lVar47)) +
                   (fVar117 * *(float *)((long)afStack_4ab4 + lVar47) -
                   *(float *)((long)afStack_45b4 + lVar47) * fVar115) +
                   (*(float *)((long)afStack_44b4 + lVar47) * fVar111 -
                   fVar113 * *(float *)((long)afStack_4bb4 + lVar47)) +
                   (fVar109 * *(float *)((long)afStack_4cb4 + lVar47) -
                   *(float *)((long)afStack_43b4 + lVar47) * fVar105) +
                   (*(float *)((long)&uStack_42b4 + lVar47) * fVar100 -
                   fVar101 * *(float *)((long)afStack_4db4 + lVar47)) +
                   (fVar99 * *(float *)((long)afStack_4eb4 + lVar47) -
                   *(float *)((long)&fStack_41b4 + lVar47) * fVar131) +
                   (fVar127 * fVar88 - fVar94 * *(float *)((long)afStack_4fb4 + lVar47));
              auVar108._4_4_ =
                   (fVar125 * fVar32 - fVar29 * fVar123) +
                   (fVar23 * fVar119 - fVar121 * fVar26) +
                   (fVar117 * fVar20 - fVar17 * fVar115) +
                   (fVar128 * fVar111 - fVar113 * fVar14) +
                   (fVar109 * fVar118 - fVar112 * fVar105) +
                   (*(float *)((long)&local_42b0 + lVar47) * fVar100 - fVar101 * fVar93) +
                   (fVar99 * fVar91 - fVar102 * fVar131) + (fVar124 * fVar88 - fVar94 * fVar96);
              auVar108._8_4_ =
                   (fVar125 * fVar33 - fVar30 * fVar123) +
                   (fVar24 * fVar119 - fVar121 * fVar27) +
                   (fVar117 * fVar21 - fVar18 * fVar115) +
                   (fVar129 * fVar111 - fVar113 * fVar15) +
                   (fVar109 * fVar120 - fVar114 * fVar105) +
                   (fVar110 * fVar100 - fVar101 * fVar97) +
                   (fVar99 * fVar92 - fVar106 * fVar131) + (fVar126 * fVar88 - fVar94 * fVar130);
              auVar108._12_4_ =
                   (fVar125 * fVar34 - fVar31 * fVar123) +
                   (fVar25 * fVar119 - fVar121 * fVar28) +
                   (fVar117 * fVar22 - fVar19 * fVar115) +
                   (fVar13 * fVar111 - fVar113 * fVar16) +
                   (fVar109 * fVar122 - fVar116 * fVar105) +
                   (*(float *)((long)&local_42a8 + lVar47) * fVar100 - fVar101 * fVar98) +
                   (fVar99 * fVar104 - *(float *)((long)afStack_41a8 + lVar47) * fVar131) +
                   (fVar95 * fVar88 - fVar94 * fVar89);
              auVar107 = minps(auVar108,auVar36);
              auVar108 = maxps(auVar107,auVar37);
              auVar107 = minps(auVar103,auVar36);
              auVar103 = maxps(auVar107,auVar37);
              auVar90._0_4_ = (int)auVar108._0_4_;
              auVar90._4_4_ = (int)auVar108._4_4_;
              auVar90._8_4_ = (int)auVar108._8_4_;
              auVar90._12_4_ = (int)auVar108._12_4_;
              auVar107._4_4_ = (int)auVar103._4_4_;
              auVar107._0_4_ = (int)auVar103._0_4_;
              auVar107._8_4_ = (int)auVar103._8_4_;
              auVar107._12_4_ = (int)auVar103._12_4_;
              auVar107 = packssdw(auVar90,auVar107);
              *(short *)((long)local_4250 + lVar77) = auVar107._2_2_;
              *(short *)((long)local_4250 + lVar74) = auVar107._10_2_;
              *(short *)((long)local_4250 + (long)local_42e8) = auVar107._0_2_;
              *(short *)((long)local_4250 + (long)local_42c0) = auVar107._8_2_;
              *(short *)((long)local_4250 + (long)local_42d0) = auVar107._6_2_;
              *(short *)((long)local_4250 + (long)local_42d8) = auVar107._14_2_;
              *(short *)((long)local_4250 + (long)local_42c8) = auVar107._4_2_;
              *(short *)((long)local_4250 + (long)pafVar71) = auVar107._12_2_;
              lVar62 = lVar62 + 0x40;
              pafVar71 = (float (*) [288])((long)pafVar71 - (long)local_4258);
              local_42d8 = (float *)((long)local_42d8 - (long)local_4258);
              local_42c8 = (bs_t *)((long)*local_4258 + (long)&local_42c8->buf);
              local_42d0 = (bs_t *)((long)local_42d0 + (long)local_4258);
              local_42c0 = (float *)((long)local_42c0 - (long)local_4258);
              lVar74 = lVar74 - (long)local_4258;
              local_42e8 = (float (*) [288])((long)*local_4258 + (long)*local_42e8);
              puVar63 = puVar63 + -0x12;
              pfVar56 = pfVar56 + -0x12;
              lVar77 = (long)*local_4258 + lVar77;
              lVar47 = lVar47 + -0x10;
              lVar67 = lVar67 + 0x12;
              lVar83 = lVar83 + 0x48;
            } while (lVar62 != 0x3c0);
            pafVar64 = (float (*) [288])((long)*local_4290 + local_41e0);
            pfVar56 = (float *)((long)local_42a0 + local_41e0);
            pbVar48 = (bs_t *)((long)&local_4280->buf + local_41e0);
            pbVar84 = local_41f0 + local_41e0;
            pfVar80 = (float *)((long)local_42e0 + local_41e0);
            lVar47 = local_41f8 + local_41e0;
            pafVar71 = (float (*) [288])((long)*local_4230 + local_41e0);
            lVar67 = local_4200 + local_41e0;
            puVar63 = local_4208 + 2;
            pfVar72 = local_4218 + 2;
            lVar74 = local_4220 + 0x200;
            lVar83 = local_4210 + 2;
            lVar77 = local_4228 + 8;
            uVar54 = local_41c0 + 2;
          } while (local_41c0 < 0x10);
          uStack_42f0 = 0x14b331;
          memcpy(local_4238,local_f80,0xf00);
          pmVar73 = local_42b0;
          if ((*(byte *)(local_4248 + 1) & 8) == 0) break;
          local_4250 = local_4250 + (long)local_4260->channels * 0x240;
          uVar76 = (ulong)((int)local_41e8 + 1);
        } while ((int)local_41e8 == 0);
      }
      uVar41 = local_3fb0.pos + 7U >> 3;
      uVar53 = ((uint)local_3fb0.limit >> 3) - uVar41;
      uVar75 = 0x1ff;
      if ((int)uVar53 < 0x1ff) {
        uVar75 = uVar53;
      }
      if (0 < (int)uVar53) {
        if (0x1ff < (int)uVar53) {
          uVar41 = ((uint)local_3fb0.limit >> 3) - 0x1ff;
        }
        uStack_42f0 = 0x14b3ce;
        memcpy(pmVar73->reserv_buf,(void *)((long)local_3fa0 + (ulong)uVar41),(ulong)uVar75);
      }
      uVar41 = (uint)uStack_42b4._3_1_;
      pmVar73->reserv = uVar75;
      bVar86 = true;
    }
    if (bVar86) {
      uVar75 = 0x180;
      if ((~pmVar73->header[1] & 6) != 0) {
        uVar75 = 0x480 >> ((pmVar73->header[1] & 0xe) == 2);
      }
      return uVar75 * uVar41;
    }
  }
  return 0;
}

Assistant:

int mp3dec_decode_frame(mp3dec_t *dec, const uint8_t *mp3, int mp3_bytes, mp3d_sample_t *pcm, mp3dec_frame_info_t *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const uint8_t *hdr;
    bs_t bs_frame[1];
    mp3dec_scratch_t scratch;

    if (mp3_bytes > 4 && dec->header[0] == 0xff && hdr_compare(dec->header, mp3))
    {
        frame_size = hdr_frame_bytes(mp3, dec->free_format_bytes) + hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + HDR_SIZE > mp3_bytes || !hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        memset(dec, 0, sizeof(mp3dec_t));
        i = mp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }

    hdr = mp3 + i;
    memcpy(dec->header, hdr, HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->channels = HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = hdr_sample_rate_hz(hdr);
    info->layer = 4 - HDR_GET_LAYER(hdr);
    info->bitrate_kbps = hdr_bitrate_kbps(hdr);

    if (!pcm)
    {
        return hdr_frame_samples(hdr);
    }

    bs_init(bs_frame, hdr + HDR_SIZE, frame_size - HDR_SIZE);
    if (HDR_IS_CRC(hdr))
    {
        get_bits(bs_frame, 16);
    }

    if (info->layer == 3)
    {
        int main_data_begin = L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            mp3dec_init(dec);
            return 0;
        }
        success = L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success)
        {
            for (igr = 0; igr < (HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm += 576*info->channels)
            {
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, pcm, scratch.syn[0]);
            }
        }
        L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef MINIMP3_ONLY_MP3
        return 0;
#else /* MINIMP3_ONLY_MP3 */
        L12_scale_info sci[1];
        L12_read_scale_info(hdr, bs_frame, sci);

        memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, pcm, scratch.syn[0]);
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                pcm += 384*info->channels;
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                mp3dec_init(dec);
                return 0;
            }
        }
#endif /* MINIMP3_ONLY_MP3 */
    }
    return success*hdr_frame_samples(dec->header);
}